

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  bool bVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  byte bVar33;
  uint uVar34;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  ulong uVar36;
  uint uVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar50 [16];
  undefined1 auVar75 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar55 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  float fVar104;
  undefined4 uVar105;
  vfloat4 a0_2;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  float t1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  vfloat4 b0;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar125;
  float fVar126;
  vfloat4 a0_3;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  __m128 a_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar165 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar170 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar177 [16];
  undefined1 auVar186 [32];
  __m128 a;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar196;
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar197 [16];
  float fVar207;
  float fVar209;
  float fVar211;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar212;
  float fVar220;
  float fVar221;
  vfloat4 a0_1;
  float fVar222;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  vfloat4 a0;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_468;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar35;
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar231 [32];
  
  PVar4 = prim[1];
  uVar30 = (ulong)(byte)PVar4;
  fVar126 = *(float *)(prim + uVar30 * 0x19 + 0x12);
  auVar42 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar42 = vinsertps_avx(auVar42,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar50 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar44 = vsubps_avx(auVar42,*(undefined1 (*) [16])(prim + uVar30 * 0x19 + 6));
  fVar125 = fVar126 * auVar44._0_4_;
  fVar104 = fVar126 * auVar50._0_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar30 * 4 + 6);
  auVar72 = vpmovsxbd_avx2(auVar42);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar30 * 5 + 6);
  auVar70 = vpmovsxbd_avx2(auVar46);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar30 * 6 + 6);
  auVar77 = vpmovsxbd_avx2(auVar3);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar30 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar51);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar81 = vpmovsxbd_avx2(auVar52);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar81);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar30 + 6);
  auVar71 = vpmovsxbd_avx2(auVar48);
  auVar71 = vcvtdq2ps_avx(auVar71);
  uVar36 = (ulong)(uint)((int)(uVar30 * 9) * 2);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar36 + 6);
  auVar78 = vpmovsxbd_avx2(auVar49);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar36 + uVar30 + 6);
  auVar79 = vpmovsxbd_avx2(auVar43);
  auVar79 = vcvtdq2ps_avx(auVar79);
  uVar28 = (ulong)(uint)((int)(uVar30 * 5) << 2);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar28 + 6);
  auVar69 = vpmovsxbd_avx2(auVar47);
  auVar80 = vcvtdq2ps_avx(auVar69);
  auVar150._4_4_ = fVar104;
  auVar150._0_4_ = fVar104;
  auVar150._8_4_ = fVar104;
  auVar150._12_4_ = fVar104;
  auVar150._16_4_ = fVar104;
  auVar150._20_4_ = fVar104;
  auVar150._24_4_ = fVar104;
  auVar150._28_4_ = fVar104;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar67 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar246 = ZEXT3264(auVar67);
  auVar83 = ZEXT1632(CONCAT412(fVar126 * auVar50._12_4_,
                               CONCAT48(fVar126 * auVar50._8_4_,
                                        CONCAT44(fVar126 * auVar50._4_4_,fVar104))));
  auVar82 = vpermps_avx2(auVar238,auVar83);
  auVar68 = vpermps_avx512vl(auVar67,auVar83);
  fVar104 = auVar68._0_4_;
  fVar196 = auVar68._4_4_;
  auVar83._4_4_ = fVar196 * auVar77._4_4_;
  auVar83._0_4_ = fVar104 * auVar77._0_4_;
  fVar207 = auVar68._8_4_;
  auVar83._8_4_ = fVar207 * auVar77._8_4_;
  fVar209 = auVar68._12_4_;
  auVar83._12_4_ = fVar209 * auVar77._12_4_;
  fVar112 = auVar68._16_4_;
  auVar83._16_4_ = fVar112 * auVar77._16_4_;
  fVar113 = auVar68._20_4_;
  auVar83._20_4_ = fVar113 * auVar77._20_4_;
  fVar114 = auVar68._24_4_;
  auVar83._24_4_ = fVar114 * auVar77._24_4_;
  auVar83._28_4_ = auVar81._28_4_;
  auVar81._4_4_ = auVar71._4_4_ * fVar196;
  auVar81._0_4_ = auVar71._0_4_ * fVar104;
  auVar81._8_4_ = auVar71._8_4_ * fVar207;
  auVar81._12_4_ = auVar71._12_4_ * fVar209;
  auVar81._16_4_ = auVar71._16_4_ * fVar112;
  auVar81._20_4_ = auVar71._20_4_ * fVar113;
  auVar81._24_4_ = auVar71._24_4_ * fVar114;
  auVar81._28_4_ = auVar69._28_4_;
  auVar69._4_4_ = auVar80._4_4_ * fVar196;
  auVar69._0_4_ = auVar80._0_4_ * fVar104;
  auVar69._8_4_ = auVar80._8_4_ * fVar207;
  auVar69._12_4_ = auVar80._12_4_ * fVar209;
  auVar69._16_4_ = auVar80._16_4_ * fVar112;
  auVar69._20_4_ = auVar80._20_4_ * fVar113;
  auVar69._24_4_ = auVar80._24_4_ * fVar114;
  auVar69._28_4_ = auVar68._28_4_;
  auVar42 = vfmadd231ps_fma(auVar83,auVar82,auVar70);
  auVar46 = vfmadd231ps_fma(auVar81,auVar82,auVar88);
  auVar3 = vfmadd231ps_fma(auVar69,auVar79,auVar82);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar150,auVar72);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar150,auVar87);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar78,auVar150);
  auVar227._4_4_ = fVar125;
  auVar227._0_4_ = fVar125;
  auVar227._8_4_ = fVar125;
  auVar227._12_4_ = fVar125;
  auVar227._16_4_ = fVar125;
  auVar227._20_4_ = fVar125;
  auVar227._24_4_ = fVar125;
  auVar227._28_4_ = fVar125;
  auVar69 = ZEXT1632(CONCAT412(fVar126 * auVar44._12_4_,
                               CONCAT48(fVar126 * auVar44._8_4_,
                                        CONCAT44(fVar126 * auVar44._4_4_,fVar125))));
  auVar81 = vpermps_avx2(auVar238,auVar69);
  auVar69 = vpermps_avx512vl(auVar67,auVar69);
  fVar126 = auVar69._0_4_;
  fVar104 = auVar69._4_4_;
  auVar82._4_4_ = fVar104 * auVar77._4_4_;
  auVar82._0_4_ = fVar126 * auVar77._0_4_;
  fVar196 = auVar69._8_4_;
  auVar82._8_4_ = fVar196 * auVar77._8_4_;
  fVar207 = auVar69._12_4_;
  auVar82._12_4_ = fVar207 * auVar77._12_4_;
  fVar209 = auVar69._16_4_;
  auVar82._16_4_ = fVar209 * auVar77._16_4_;
  fVar112 = auVar69._20_4_;
  auVar82._20_4_ = fVar112 * auVar77._20_4_;
  fVar113 = auVar69._24_4_;
  auVar82._24_4_ = fVar113 * auVar77._24_4_;
  auVar82._28_4_ = 1;
  auVar67._4_4_ = auVar71._4_4_ * fVar104;
  auVar67._0_4_ = auVar71._0_4_ * fVar126;
  auVar67._8_4_ = auVar71._8_4_ * fVar196;
  auVar67._12_4_ = auVar71._12_4_ * fVar207;
  auVar67._16_4_ = auVar71._16_4_ * fVar209;
  auVar67._20_4_ = auVar71._20_4_ * fVar112;
  auVar67._24_4_ = auVar71._24_4_ * fVar113;
  auVar67._28_4_ = auVar77._28_4_;
  auVar71._4_4_ = auVar80._4_4_ * fVar104;
  auVar71._0_4_ = auVar80._0_4_ * fVar126;
  auVar71._8_4_ = auVar80._8_4_ * fVar196;
  auVar71._12_4_ = auVar80._12_4_ * fVar207;
  auVar71._16_4_ = auVar80._16_4_ * fVar209;
  auVar71._20_4_ = auVar80._20_4_ * fVar112;
  auVar71._24_4_ = auVar80._24_4_ * fVar113;
  auVar71._28_4_ = auVar69._28_4_;
  auVar51 = vfmadd231ps_fma(auVar82,auVar81,auVar70);
  auVar52 = vfmadd231ps_fma(auVar67,auVar81,auVar88);
  auVar48 = vfmadd231ps_fma(auVar71,auVar81,auVar79);
  auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar227,auVar72);
  auVar52 = vfmadd231ps_fma(ZEXT1632(auVar52),auVar227,auVar87);
  auVar90._8_4_ = 0x7fffffff;
  auVar90._0_8_ = 0x7fffffff7fffffff;
  auVar90._12_4_ = 0x7fffffff;
  auVar90._16_4_ = 0x7fffffff;
  auVar90._20_4_ = 0x7fffffff;
  auVar90._24_4_ = 0x7fffffff;
  auVar90._28_4_ = 0x7fffffff;
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar227,auVar78);
  auVar72 = vandps_avx(ZEXT1632(auVar42),auVar90);
  auVar137._8_4_ = 0x219392ef;
  auVar137._0_8_ = 0x219392ef219392ef;
  auVar137._12_4_ = 0x219392ef;
  auVar137._16_4_ = 0x219392ef;
  auVar137._20_4_ = 0x219392ef;
  auVar137._24_4_ = 0x219392ef;
  auVar137._28_4_ = 0x219392ef;
  uVar36 = vcmpps_avx512vl(auVar72,auVar137,1);
  bVar27 = (bool)((byte)uVar36 & 1);
  auVar68._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar42._0_4_;
  bVar27 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar68._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar42._4_4_;
  bVar27 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar68._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar42._8_4_;
  bVar27 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar68._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar42._12_4_;
  auVar68._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar68._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar68._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar68._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar46),auVar90);
  uVar36 = vcmpps_avx512vl(auVar72,auVar137,1);
  bVar27 = (bool)((byte)uVar36 & 1);
  auVar84._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar46._0_4_;
  bVar27 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar46._4_4_;
  bVar27 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar46._8_4_;
  bVar27 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar46._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar3),auVar90);
  uVar36 = vcmpps_avx512vl(auVar72,auVar137,1);
  bVar27 = (bool)((byte)uVar36 & 1);
  auVar72._0_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar3._0_4_;
  bVar27 = (bool)((byte)(uVar36 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar3._4_4_;
  bVar27 = (bool)((byte)(uVar36 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar3._8_4_;
  bVar27 = (bool)((byte)(uVar36 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar27 * 0x219392ef | (uint)!bVar27 * auVar3._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar36 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar36 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar36 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar36 >> 7) * 0x219392ef;
  auVar70 = vrcp14ps_avx512vl(auVar68);
  auVar91._8_4_ = 0x3f800000;
  auVar91._0_8_ = 0x3f8000003f800000;
  auVar91._12_4_ = 0x3f800000;
  auVar91._16_4_ = 0x3f800000;
  auVar91._20_4_ = 0x3f800000;
  auVar91._24_4_ = 0x3f800000;
  auVar91._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar68,auVar70,auVar91);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar84);
  auVar46 = vfnmadd213ps_fma(auVar84,auVar70,auVar91);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar70,auVar70);
  auVar70 = vrcp14ps_avx512vl(auVar72);
  auVar3 = vfnmadd213ps_fma(auVar72,auVar70,auVar91);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar70,auVar70);
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 7 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar51));
  auVar78._4_4_ = auVar42._4_4_ * auVar72._4_4_;
  auVar78._0_4_ = auVar42._0_4_ * auVar72._0_4_;
  auVar78._8_4_ = auVar42._8_4_ * auVar72._8_4_;
  auVar78._12_4_ = auVar42._12_4_ * auVar72._12_4_;
  auVar78._16_4_ = auVar72._16_4_ * 0.0;
  auVar78._20_4_ = auVar72._20_4_ * 0.0;
  auVar78._24_4_ = auVar72._24_4_ * 0.0;
  auVar78._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 9 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar51));
  auVar71 = vpbroadcastd_avx512vl();
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar89._0_4_ = auVar42._0_4_ * auVar72._0_4_;
  auVar89._4_4_ = auVar42._4_4_ * auVar72._4_4_;
  auVar89._8_4_ = auVar42._8_4_ * auVar72._8_4_;
  auVar89._12_4_ = auVar42._12_4_ * auVar72._12_4_;
  auVar89._16_4_ = auVar72._16_4_ * 0.0;
  auVar89._20_4_ = auVar72._20_4_ * 0.0;
  auVar89._24_4_ = auVar72._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar30 * -2 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar52));
  auVar79._4_4_ = auVar46._4_4_ * auVar72._4_4_;
  auVar79._0_4_ = auVar46._0_4_ * auVar72._0_4_;
  auVar79._8_4_ = auVar46._8_4_ * auVar72._8_4_;
  auVar79._12_4_ = auVar46._12_4_ * auVar72._12_4_;
  auVar79._16_4_ = auVar72._16_4_ * 0.0;
  auVar79._20_4_ = auVar72._20_4_ * 0.0;
  auVar79._24_4_ = auVar72._24_4_ * 0.0;
  auVar79._28_4_ = auVar72._28_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar52));
  auVar86._0_4_ = auVar46._0_4_ * auVar72._0_4_;
  auVar86._4_4_ = auVar46._4_4_ * auVar72._4_4_;
  auVar86._8_4_ = auVar46._8_4_ * auVar72._8_4_;
  auVar86._12_4_ = auVar46._12_4_ * auVar72._12_4_;
  auVar86._16_4_ = auVar72._16_4_ * 0.0;
  auVar86._20_4_ = auVar72._20_4_ * 0.0;
  auVar86._24_4_ = auVar72._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 + uVar30 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar48));
  auVar80._4_4_ = auVar72._4_4_ * auVar3._4_4_;
  auVar80._0_4_ = auVar72._0_4_ * auVar3._0_4_;
  auVar80._8_4_ = auVar72._8_4_ * auVar3._8_4_;
  auVar80._12_4_ = auVar72._12_4_ * auVar3._12_4_;
  auVar80._16_4_ = auVar72._16_4_ * 0.0;
  auVar80._20_4_ = auVar72._20_4_ * 0.0;
  auVar80._24_4_ = auVar72._24_4_ * 0.0;
  auVar80._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar30 * 0x17 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar48));
  auVar85._0_4_ = auVar3._0_4_ * auVar72._0_4_;
  auVar85._4_4_ = auVar3._4_4_ * auVar72._4_4_;
  auVar85._8_4_ = auVar3._8_4_ * auVar72._8_4_;
  auVar85._12_4_ = auVar3._12_4_ * auVar72._12_4_;
  auVar85._16_4_ = auVar72._16_4_ * 0.0;
  auVar85._20_4_ = auVar72._20_4_ * 0.0;
  auVar85._24_4_ = auVar72._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar72 = vpminsd_avx2(auVar78,auVar89);
  auVar70 = vpminsd_avx2(auVar79,auVar86);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx2(auVar80,auVar85);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar77._4_4_ = uVar105;
  auVar77._0_4_ = uVar105;
  auVar77._8_4_ = uVar105;
  auVar77._12_4_ = uVar105;
  auVar77._16_4_ = uVar105;
  auVar77._20_4_ = uVar105;
  auVar77._24_4_ = uVar105;
  auVar77._28_4_ = uVar105;
  auVar70 = vmaxps_avx512vl(auVar70,auVar77);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  auVar70._16_4_ = 0x3f7ffffa;
  auVar70._20_4_ = 0x3f7ffffa;
  auVar70._24_4_ = 0x3f7ffffa;
  auVar70._28_4_ = 0x3f7ffffa;
  local_1c0 = vmulps_avx512vl(auVar72,auVar70);
  auVar72 = vpmaxsd_avx2(auVar78,auVar89);
  auVar70 = vpmaxsd_avx2(auVar79,auVar86);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx2(auVar80,auVar85);
  uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar87._4_4_ = uVar105;
  auVar87._0_4_ = uVar105;
  auVar87._8_4_ = uVar105;
  auVar87._12_4_ = uVar105;
  auVar87._16_4_ = uVar105;
  auVar87._20_4_ = uVar105;
  auVar87._24_4_ = uVar105;
  auVar87._28_4_ = uVar105;
  auVar70 = vminps_avx512vl(auVar70,auVar87);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar88);
  uVar16 = vpcmpgtd_avx512vl(auVar71,_DAT_01fe9900);
  uVar15 = vcmpps_avx512vl(local_1c0,auVar72,2);
  if ((byte)((byte)uVar15 & (byte)uVar16) == 0) {
    return false;
  }
  uVar36 = (ulong)(byte)((byte)uVar15 & (byte)uVar16);
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar239 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar242 = ZEXT1664(auVar42);
  auVar248 = ZEXT464(0x3f800000);
  auVar42 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar247 = ZEXT1664(auVar42);
LAB_01d030df:
  lVar32 = 0;
  for (uVar28 = uVar36; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar32 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar42 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar28);
  lVar32 = uVar28 + 1;
  auVar46 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar32);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar3 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar28);
  auVar51 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar32);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar232._8_4_ = 0x3eaaaaab;
  auVar232._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar232._12_4_ = 0x3eaaaaab;
  auVar48 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar7[2].intersectionFilterN +
                             (long)pGVar7[2].pointQueryFunc * uVar28),auVar42,auVar232);
  auVar47 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar7[2].intersectionFilterN +
                              (long)pGVar7[2].pointQueryFunc * lVar32),auVar46,auVar232);
  auVar49 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar7[3].userPtr +
                             uVar28 * *(long *)&pGVar7[3].fnumTimeSegments),auVar3,auVar232);
  auVar50 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              ((long)pGVar7[3].userPtr +
                              *(long *)&pGVar7[3].fnumTimeSegments * lVar32),auVar51,auVar232);
  auVar74._16_16_ = local_1e0._16_16_;
  auVar74._0_16_ = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar43 = vmulps_avx512vl(auVar46,auVar74._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar43,auVar47,auVar74._0_16_);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar44);
  auVar168._0_4_ = auVar43._0_4_ + auVar42._0_4_;
  auVar168._4_4_ = auVar43._4_4_ + auVar42._4_4_;
  auVar168._8_4_ = auVar43._8_4_ + auVar42._8_4_;
  auVar168._12_4_ = auVar43._12_4_ + auVar42._12_4_;
  auVar106 = auVar239._0_16_;
  auVar43 = vfmadd231ps_avx512vl(auVar44,auVar48,auVar106);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar42,auVar106);
  auVar43 = vmulps_avx512vl(auVar51,auVar74._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar74._0_16_);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar49,auVar45);
  auVar223._0_4_ = auVar43._0_4_ + auVar3._0_4_;
  auVar223._4_4_ = auVar43._4_4_ + auVar3._4_4_;
  auVar223._8_4_ = auVar43._8_4_ + auVar3._8_4_;
  auVar223._12_4_ = auVar43._12_4_ + auVar3._12_4_;
  auVar43 = vfmadd231ps_avx512vl(auVar45,auVar49,auVar106);
  auVar45 = vfnmadd231ps_avx512vl(auVar43,auVar3,auVar106);
  auVar43 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar46);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar48,auVar74._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar42,auVar74._0_16_);
  auVar46 = vmulps_avx512vl(auVar46,auVar106);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar106,auVar47);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar74._0_16_,auVar48);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar74._0_16_,auVar42);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar51);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar74._0_16_);
  auVar48 = vfmadd231ps_avx512vl(auVar42,auVar3,auVar74._0_16_);
  auVar42 = vmulps_avx512vl(auVar51,auVar106);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar106,auVar50);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar74._0_16_,auVar49);
  auVar49 = vfnmadd231ps_avx512vl(auVar42,auVar74._0_16_,auVar3);
  auVar42 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar46 = vshufps_avx(auVar223,auVar223,0xc9);
  fVar125 = auVar44._0_4_;
  auVar64._0_4_ = fVar125 * auVar46._0_4_;
  fVar166 = auVar44._4_4_;
  auVar64._4_4_ = fVar166 * auVar46._4_4_;
  fVar167 = auVar44._8_4_;
  auVar64._8_4_ = fVar167 * auVar46._8_4_;
  fVar211 = auVar44._12_4_;
  auVar64._12_4_ = fVar211 * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar64,auVar42,auVar223);
  auVar3 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar140._0_4_ = fVar125 * auVar46._0_4_;
  auVar140._4_4_ = fVar166 * auVar46._4_4_;
  auVar140._8_4_ = fVar167 * auVar46._8_4_;
  auVar140._12_4_ = fVar211 * auVar46._12_4_;
  auVar42 = vfmsub231ps_fma(auVar140,auVar42,auVar45);
  auVar51 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar46 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar126 = auVar47._0_4_;
  auVar187._0_4_ = auVar46._0_4_ * fVar126;
  fVar104 = auVar47._4_4_;
  auVar187._4_4_ = auVar46._4_4_ * fVar104;
  fVar196 = auVar47._8_4_;
  auVar187._8_4_ = auVar46._8_4_ * fVar196;
  fVar207 = auVar47._12_4_;
  auVar187._12_4_ = auVar46._12_4_ * fVar207;
  auVar46 = vfmsub231ps_fma(auVar187,auVar42,auVar48);
  auVar48 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar188._0_4_ = auVar46._0_4_ * fVar126;
  auVar188._4_4_ = auVar46._4_4_ * fVar104;
  auVar188._8_4_ = auVar46._8_4_ * fVar196;
  auVar188._12_4_ = auVar46._12_4_ * fVar207;
  auVar42 = vfmsub231ps_fma(auVar188,auVar42,auVar49);
  auVar49 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar209 = auVar42._0_4_;
  auVar73._4_28_ = auVar74._4_28_;
  auVar73._0_4_ = fVar209;
  auVar46 = vrsqrt14ss_avx512f(auVar74._0_16_,auVar73._0_16_);
  auVar50 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar45 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar112 = auVar46._0_4_;
  fVar113 = auVar50._0_4_ - auVar45._0_4_ * fVar112 * fVar112 * fVar112;
  fVar212 = fVar113 * auVar3._0_4_;
  fVar220 = fVar113 * auVar3._4_4_;
  fVar221 = fVar113 * auVar3._8_4_;
  fVar222 = fVar113 * auVar3._12_4_;
  auVar46 = vdpps_avx(auVar3,auVar51,0x7f);
  auVar141._0_4_ = fVar209 * auVar51._0_4_;
  auVar141._4_4_ = fVar209 * auVar51._4_4_;
  auVar141._8_4_ = fVar209 * auVar51._8_4_;
  auVar141._12_4_ = fVar209 * auVar51._12_4_;
  fVar209 = auVar46._0_4_;
  auVar65._0_4_ = fVar209 * auVar3._0_4_;
  auVar65._4_4_ = fVar209 * auVar3._4_4_;
  auVar65._8_4_ = fVar209 * auVar3._8_4_;
  auVar65._12_4_ = fVar209 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar141,auVar65);
  auVar46 = vrcp14ss_avx512f(auVar74._0_16_,auVar73._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar46,ZEXT416(0x40000000));
  fVar209 = auVar46._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar112 = auVar42._0_4_;
  auVar76._16_16_ = auVar74._16_16_;
  auVar76._0_16_ = auVar74._0_16_;
  auVar75._4_28_ = auVar76._4_28_;
  auVar75._0_4_ = fVar112;
  auVar46 = vrsqrt14ss_avx512f(auVar74._0_16_,auVar75._0_16_);
  auVar51 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar50 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar114 = auVar46._0_4_;
  fVar114 = auVar51._0_4_ - auVar50._0_4_ * fVar114 * fVar114 * fVar114;
  fVar195 = fVar114 * auVar48._0_4_;
  fVar206 = fVar114 * auVar48._4_4_;
  fVar208 = fVar114 * auVar48._8_4_;
  fVar210 = fVar114 * auVar48._12_4_;
  auVar46 = vdpps_avx(auVar48,auVar49,0x7f);
  auVar66._0_4_ = fVar112 * auVar49._0_4_;
  auVar66._4_4_ = fVar112 * auVar49._4_4_;
  auVar66._8_4_ = fVar112 * auVar49._8_4_;
  auVar66._12_4_ = fVar112 * auVar49._12_4_;
  fVar112 = auVar46._0_4_;
  auVar45._0_4_ = fVar112 * auVar48._0_4_;
  auVar45._4_4_ = fVar112 * auVar48._4_4_;
  auVar45._8_4_ = fVar112 * auVar48._8_4_;
  auVar45._12_4_ = fVar112 * auVar48._12_4_;
  auVar51 = vsubps_avx(auVar66,auVar45);
  auVar46 = vrcp14ss_avx512f(auVar74._0_16_,auVar75._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar46,ZEXT416(0x40000000));
  fVar112 = auVar46._0_4_ * auVar42._0_4_;
  auVar42 = vshufps_avx(auVar168,auVar168,0xff);
  auVar133._0_4_ = fVar212 * auVar42._0_4_;
  auVar133._4_4_ = fVar220 * auVar42._4_4_;
  auVar133._8_4_ = fVar221 * auVar42._8_4_;
  auVar133._12_4_ = fVar222 * auVar42._12_4_;
  local_330 = vsubps_avx(auVar168,auVar133);
  auVar46 = vshufps_avx(auVar44,auVar44,0xff);
  auVar58._0_4_ = fVar212 * auVar46._0_4_ + auVar42._0_4_ * fVar113 * auVar3._0_4_ * fVar209;
  auVar58._4_4_ = fVar220 * auVar46._4_4_ + auVar42._4_4_ * fVar113 * auVar3._4_4_ * fVar209;
  auVar58._8_4_ = fVar221 * auVar46._8_4_ + auVar42._8_4_ * fVar113 * auVar3._8_4_ * fVar209;
  auVar58._12_4_ = fVar222 * auVar46._12_4_ + auVar42._12_4_ * fVar113 * auVar3._12_4_ * fVar209;
  auVar3 = vsubps_avx(auVar44,auVar58);
  local_340._0_4_ = auVar168._0_4_ + auVar133._0_4_;
  local_340._4_4_ = auVar168._4_4_ + auVar133._4_4_;
  fStack_338 = auVar168._8_4_ + auVar133._8_4_;
  fStack_334 = auVar168._12_4_ + auVar133._12_4_;
  auVar42 = vshufps_avx(auVar43,auVar43,0xff);
  auVar142._0_4_ = fVar195 * auVar42._0_4_;
  auVar142._4_4_ = fVar206 * auVar42._4_4_;
  auVar142._8_4_ = fVar208 * auVar42._8_4_;
  auVar142._12_4_ = fVar210 * auVar42._12_4_;
  local_350 = vsubps_avx512vl(auVar43,auVar142);
  auVar46 = vshufps_avx(auVar47,auVar47,0xff);
  auVar44._0_4_ = fVar195 * auVar46._0_4_ + auVar42._0_4_ * fVar114 * auVar51._0_4_ * fVar112;
  auVar44._4_4_ = fVar206 * auVar46._4_4_ + auVar42._4_4_ * fVar114 * auVar51._4_4_ * fVar112;
  auVar44._8_4_ = fVar208 * auVar46._8_4_ + auVar42._8_4_ * fVar114 * auVar51._8_4_ * fVar112;
  auVar44._12_4_ = fVar210 * auVar46._12_4_ + auVar42._12_4_ * fVar114 * auVar51._12_4_ * fVar112;
  auVar42 = vsubps_avx(auVar47,auVar44);
  _local_360 = vaddps_avx512vl(auVar43,auVar142);
  auVar115._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar115._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar115._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar115._12_4_ = auVar3._12_4_ * 0.33333334;
  local_370 = vaddps_avx512vl(local_330,auVar115);
  auVar55._0_4_ = auVar42._0_4_ * 0.33333334;
  auVar55._4_4_ = auVar42._4_4_ * 0.33333334;
  auVar55._8_4_ = auVar42._8_4_ * 0.33333334;
  auVar55._12_4_ = auVar42._12_4_ * 0.33333334;
  local_380 = vsubps_avx512vl(local_350,auVar55);
  auVar53._0_4_ = (fVar125 + auVar58._0_4_) * 0.33333334;
  auVar53._4_4_ = (fVar166 + auVar58._4_4_) * 0.33333334;
  auVar53._8_4_ = (fVar167 + auVar58._8_4_) * 0.33333334;
  auVar53._12_4_ = (fVar211 + auVar58._12_4_) * 0.33333334;
  _local_390 = vaddps_avx512vl(_local_340,auVar53);
  auVar106._0_4_ = (fVar126 + auVar44._0_4_) * 0.33333334;
  auVar106._4_4_ = (fVar104 + auVar44._4_4_) * 0.33333334;
  auVar106._8_4_ = (fVar196 + auVar44._8_4_) * 0.33333334;
  auVar106._12_4_ = (fVar207 + auVar44._12_4_) * 0.33333334;
  _local_3a0 = vsubps_avx512vl(_local_360,auVar106);
  local_2b0 = vsubps_avx(local_330,auVar52);
  uVar105 = local_2b0._0_4_;
  auVar54._4_4_ = uVar105;
  auVar54._0_4_ = uVar105;
  auVar54._8_4_ = uVar105;
  auVar54._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar46 = vshufps_avx(local_2b0,local_2b0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar126 = pre->ray_space[k].vz.field_0.m128[0];
  fVar104 = pre->ray_space[k].vz.field_0.m128[1];
  fVar196 = pre->ray_space[k].vz.field_0.m128[2];
  fVar207 = pre->ray_space[k].vz.field_0.m128[3];
  auVar107._0_4_ = fVar126 * auVar46._0_4_;
  auVar107._4_4_ = fVar104 * auVar46._4_4_;
  auVar107._8_4_ = fVar196 * auVar46._8_4_;
  auVar107._12_4_ = fVar207 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar42);
  auVar43 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar54);
  local_2c0 = vsubps_avx512vl(local_370,auVar52);
  uVar105 = local_2c0._0_4_;
  auVar59._4_4_ = uVar105;
  auVar59._0_4_ = uVar105;
  auVar59._8_4_ = uVar105;
  auVar59._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar46 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar63._0_4_ = fVar126 * auVar46._0_4_;
  auVar63._4_4_ = fVar104 * auVar46._4_4_;
  auVar63._8_4_ = fVar196 * auVar46._8_4_;
  auVar63._12_4_ = fVar207 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar59);
  local_2d0 = vsubps_avx512vl(local_380,auVar52);
  uVar105 = local_2d0._0_4_;
  auVar62._4_4_ = uVar105;
  auVar62._0_4_ = uVar105;
  auVar62._8_4_ = uVar105;
  auVar62._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar46 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar169._0_4_ = auVar46._0_4_ * fVar126;
  auVar169._4_4_ = auVar46._4_4_ * fVar104;
  auVar169._8_4_ = auVar46._8_4_ * fVar196;
  auVar169._12_4_ = auVar46._12_4_ * fVar207;
  auVar42 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar2,auVar42);
  auVar50 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar62);
  local_2e0 = vsubps_avx512vl(local_350,auVar52);
  uVar105 = local_2e0._0_4_;
  auVar60._4_4_ = uVar105;
  auVar60._0_4_ = uVar105;
  auVar60._8_4_ = uVar105;
  auVar60._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar46 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar176._0_4_ = auVar46._0_4_ * fVar126;
  auVar176._4_4_ = auVar46._4_4_ * fVar104;
  auVar176._8_4_ = auVar46._8_4_ * fVar196;
  auVar176._12_4_ = auVar46._12_4_ * fVar207;
  auVar42 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar2,auVar42);
  auVar44 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar60);
  local_2f0 = vsubps_avx(_local_340,auVar52);
  uVar105 = local_2f0._0_4_;
  auVar61._4_4_ = uVar105;
  auVar61._0_4_ = uVar105;
  auVar61._8_4_ = uVar105;
  auVar61._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar46 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar189._0_4_ = auVar46._0_4_ * fVar126;
  auVar189._4_4_ = auVar46._4_4_ * fVar104;
  auVar189._8_4_ = auVar46._8_4_ * fVar196;
  auVar189._12_4_ = auVar46._12_4_ * fVar207;
  auVar42 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar2,auVar42);
  auVar45 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar61);
  local_300 = vsubps_avx512vl(_local_390,auVar52);
  uVar105 = local_300._0_4_;
  auVar117._4_4_ = uVar105;
  auVar117._0_4_ = uVar105;
  auVar117._8_4_ = uVar105;
  auVar117._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_300,local_300,0x55);
  auVar46 = vshufps_avx(local_300,local_300,0xaa);
  auVar197._0_4_ = auVar46._0_4_ * fVar126;
  auVar197._4_4_ = auVar46._4_4_ * fVar104;
  auVar197._8_4_ = auVar46._8_4_ * fVar196;
  auVar197._12_4_ = auVar46._12_4_ * fVar207;
  auVar42 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar2,auVar42);
  auVar106 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar117);
  local_310 = vsubps_avx(_local_3a0,auVar52);
  uVar105 = local_310._0_4_;
  auVar56._4_4_ = uVar105;
  auVar56._0_4_ = uVar105;
  auVar56._8_4_ = uVar105;
  auVar56._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_310,local_310,0x55);
  auVar46 = vshufps_avx(local_310,local_310,0xaa);
  auVar213._0_4_ = auVar46._0_4_ * fVar126;
  auVar213._4_4_ = auVar46._4_4_ * fVar104;
  auVar213._8_4_ = auVar46._8_4_ * fVar196;
  auVar213._12_4_ = auVar46._12_4_ * fVar207;
  auVar42 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar2,auVar42);
  auVar107 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar56);
  local_320 = vsubps_avx512vl(_local_360,auVar52);
  uVar105 = local_320._0_4_;
  auVar57._4_4_ = uVar105;
  auVar57._0_4_ = uVar105;
  auVar57._8_4_ = uVar105;
  auVar57._12_4_ = uVar105;
  auVar42 = vshufps_avx(local_320,local_320,0x55);
  auVar46 = vshufps_avx(local_320,local_320,0xaa);
  auVar143._0_4_ = fVar126 * auVar46._0_4_;
  auVar143._4_4_ = fVar104 * auVar46._4_4_;
  auVar143._8_4_ = fVar196 * auVar46._8_4_;
  auVar143._12_4_ = fVar207 * auVar46._12_4_;
  auVar42 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar2,auVar42);
  auVar115 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar1,auVar57);
  auVar3 = vmovlhps_avx(auVar43,auVar45);
  auVar51 = vmovlhps_avx(auVar47,auVar106);
  auVar48 = vmovlhps_avx512f(auVar50,auVar107);
  auVar49 = vmovlhps_avx512f(auVar44,auVar115);
  auVar46 = vminps_avx(auVar3,auVar51);
  auVar42 = vmaxps_avx(auVar3,auVar51);
  auVar52 = vminps_avx512vl(auVar48,auVar49);
  auVar46 = vminps_avx(auVar46,auVar52);
  auVar52 = vmaxps_avx512vl(auVar48,auVar49);
  auVar42 = vmaxps_avx(auVar42,auVar52);
  auVar52 = vshufpd_avx(auVar46,auVar46,3);
  auVar46 = vminps_avx(auVar46,auVar52);
  auVar52 = vshufpd_avx(auVar42,auVar42,3);
  auVar42 = vmaxps_avx(auVar42,auVar52);
  auVar46 = vandps_avx512vl(auVar46,auVar241._0_16_);
  auVar42 = vandps_avx512vl(auVar42,auVar241._0_16_);
  auVar42 = vmaxps_avx(auVar46,auVar42);
  auVar46 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar46,auVar42);
  local_468 = (uint)uVar36 + 0xff;
  fVar126 = auVar42._0_4_ * 9.536743e-07;
  auVar52 = vmovddup_avx512vl(auVar43);
  auVar43 = vmovddup_avx512vl(auVar47);
  auVar170._0_8_ = auVar50._0_8_;
  auVar170._8_8_ = auVar170._0_8_;
  auVar177._0_8_ = auVar44._0_8_;
  auVar177._8_8_ = auVar177._0_8_;
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar126));
  auVar42 = vxorps_avx512vl(local_260._0_16_,auVar242._0_16_);
  local_280 = vbroadcastss_avx512vl(auVar42);
  bVar27 = false;
  uVar28 = 0;
  uVar37 = *(uint *)(ray + k * 4 + 0x60);
  auVar42 = vsubps_avx(auVar51,auVar3);
  local_290 = vsubps_avx512vl(auVar48,auVar51);
  local_2a0 = vsubps_avx512vl(auVar49,auVar48);
  local_3b0 = vsubps_avx(_local_340,local_330);
  local_3c0 = vsubps_avx512vl(_local_390,local_370);
  local_3d0 = vsubps_avx512vl(_local_3a0,local_380);
  _local_3e0 = vsubps_avx512vl(_local_360,local_350);
  local_200 = vpbroadcastd_avx512vl();
  auVar46 = ZEXT816(0x3f80000000000000);
  auVar50 = auVar46;
LAB_01d037d9:
  do {
    auVar47 = vshufps_avx(auVar50,auVar50,0x50);
    auVar228._8_4_ = 0x3f800000;
    auVar228._0_8_ = 0x3f8000003f800000;
    auVar228._12_4_ = 0x3f800000;
    auVar231._16_4_ = 0x3f800000;
    auVar231._0_16_ = auVar228;
    auVar231._20_4_ = 0x3f800000;
    auVar231._24_4_ = 0x3f800000;
    auVar231._28_4_ = 0x3f800000;
    auVar44 = vsubps_avx(auVar228,auVar47);
    fVar104 = auVar47._0_4_;
    fVar112 = auVar45._0_4_;
    auVar134._0_4_ = fVar112 * fVar104;
    fVar196 = auVar47._4_4_;
    fVar113 = auVar45._4_4_;
    auVar134._4_4_ = fVar113 * fVar196;
    fVar207 = auVar47._8_4_;
    auVar134._8_4_ = fVar112 * fVar207;
    fVar209 = auVar47._12_4_;
    auVar134._12_4_ = fVar113 * fVar209;
    fVar114 = auVar106._0_4_;
    auVar144._0_4_ = fVar114 * fVar104;
    fVar125 = auVar106._4_4_;
    auVar144._4_4_ = fVar125 * fVar196;
    auVar144._8_4_ = fVar114 * fVar207;
    auVar144._12_4_ = fVar125 * fVar209;
    fVar166 = auVar107._0_4_;
    auVar153._0_4_ = fVar166 * fVar104;
    fVar167 = auVar107._4_4_;
    auVar153._4_4_ = fVar167 * fVar196;
    auVar153._8_4_ = fVar166 * fVar207;
    auVar153._12_4_ = fVar167 * fVar209;
    fVar208 = auVar115._0_4_;
    auVar118._0_4_ = fVar208 * fVar104;
    fVar210 = auVar115._4_4_;
    auVar118._4_4_ = fVar210 * fVar196;
    auVar118._8_4_ = fVar208 * fVar207;
    auVar118._12_4_ = fVar210 * fVar209;
    auVar53 = vfmadd231ps_avx512vl(auVar134,auVar44,auVar52);
    auVar54 = vfmadd231ps_avx512vl(auVar144,auVar44,auVar43);
    auVar55 = vfmadd231ps_fma(auVar153,auVar44,auVar170);
    auVar44 = vfmadd231ps_fma(auVar118,auVar177,auVar44);
    auVar47 = vmovshdup_avx(auVar46);
    fVar196 = auVar46._0_4_;
    fVar104 = (auVar47._0_4_ - fVar196) * 0.04761905;
    auVar175._4_4_ = fVar196;
    auVar175._0_4_ = fVar196;
    auVar175._8_4_ = fVar196;
    auVar175._12_4_ = fVar196;
    auVar175._16_4_ = fVar196;
    auVar175._20_4_ = fVar196;
    auVar175._24_4_ = fVar196;
    auVar175._28_4_ = fVar196;
    auVar131._0_8_ = auVar47._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar131._16_8_ = auVar131._0_8_;
    auVar131._24_8_ = auVar131._0_8_;
    auVar72 = vsubps_avx(auVar131,auVar175);
    uVar105 = auVar53._0_4_;
    auVar132._4_4_ = uVar105;
    auVar132._0_4_ = uVar105;
    auVar132._8_4_ = uVar105;
    auVar132._12_4_ = uVar105;
    auVar132._16_4_ = uVar105;
    auVar132._20_4_ = uVar105;
    auVar132._24_4_ = uVar105;
    auVar132._28_4_ = uVar105;
    auVar192._8_4_ = 1;
    auVar192._0_8_ = 0x100000001;
    auVar192._12_4_ = 1;
    auVar192._16_4_ = 1;
    auVar192._20_4_ = 1;
    auVar192._24_4_ = 1;
    auVar192._28_4_ = 1;
    auVar87 = ZEXT1632(auVar53);
    auVar70 = vpermps_avx2(auVar192,auVar87);
    auVar77 = vbroadcastss_avx512vl(auVar54);
    auVar88 = ZEXT1632(auVar54);
    auVar71 = vpermps_avx512vl(auVar192,auVar88);
    auVar78 = vbroadcastss_avx512vl(auVar55);
    auVar68 = ZEXT1632(auVar55);
    auVar79 = vpermps_avx512vl(auVar192,auVar68);
    auVar80 = vbroadcastss_avx512vl(auVar44);
    auVar84 = ZEXT1632(auVar44);
    auVar81 = vpermps_avx512vl(auVar192,auVar84);
    auVar193._4_4_ = fVar104;
    auVar193._0_4_ = fVar104;
    auVar193._8_4_ = fVar104;
    auVar193._12_4_ = fVar104;
    auVar193._16_4_ = fVar104;
    auVar193._20_4_ = fVar104;
    auVar193._24_4_ = fVar104;
    auVar193._28_4_ = fVar104;
    auVar85 = auVar246._0_32_;
    auVar69 = vpermps_avx512vl(auVar85,auVar87);
    auVar165._8_4_ = 3;
    auVar165._0_8_ = 0x300000003;
    auVar165._12_4_ = 3;
    auVar165._16_4_ = 3;
    auVar165._20_4_ = 3;
    auVar165._24_4_ = 3;
    auVar165._28_4_ = 3;
    auVar82 = vpermps_avx512vl(auVar165,auVar87);
    auVar83 = vpermps_avx512vl(auVar85,auVar88);
    auVar87 = vpermps_avx2(auVar165,auVar88);
    auVar67 = vpermps_avx512vl(auVar85,auVar68);
    auVar88 = vpermps_avx2(auVar165,auVar68);
    auVar68 = vpermps_avx512vl(auVar85,auVar84);
    auVar84 = vpermps_avx512vl(auVar165,auVar84);
    auVar47 = vfmadd132ps_fma(auVar72,auVar175,_DAT_01faff20);
    auVar72 = vsubps_avx(auVar231,ZEXT1632(auVar47));
    auVar85 = vmulps_avx512vl(auVar77,ZEXT1632(auVar47));
    auVar89 = ZEXT1632(auVar47);
    auVar86 = vmulps_avx512vl(auVar71,auVar89);
    auVar44 = vfmadd231ps_fma(auVar85,auVar72,auVar132);
    auVar55 = vfmadd231ps_fma(auVar86,auVar72,auVar70);
    auVar85 = vmulps_avx512vl(auVar78,auVar89);
    auVar86 = vmulps_avx512vl(auVar79,auVar89);
    auVar77 = vfmadd231ps_avx512vl(auVar85,auVar72,auVar77);
    auVar71 = vfmadd231ps_avx512vl(auVar86,auVar72,auVar71);
    auVar85 = vmulps_avx512vl(auVar80,auVar89);
    auVar86 = ZEXT1632(auVar47);
    auVar81 = vmulps_avx512vl(auVar81,auVar86);
    auVar78 = vfmadd231ps_avx512vl(auVar85,auVar72,auVar78);
    auVar79 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar79);
    fVar207 = auVar47._0_4_;
    fVar209 = auVar47._4_4_;
    auVar21._4_4_ = fVar209 * auVar77._4_4_;
    auVar21._0_4_ = fVar207 * auVar77._0_4_;
    fVar211 = auVar47._8_4_;
    auVar21._8_4_ = fVar211 * auVar77._8_4_;
    fVar195 = auVar47._12_4_;
    auVar21._12_4_ = fVar195 * auVar77._12_4_;
    auVar21._16_4_ = auVar77._16_4_ * 0.0;
    auVar21._20_4_ = auVar77._20_4_ * 0.0;
    auVar21._24_4_ = auVar77._24_4_ * 0.0;
    auVar21._28_4_ = fVar196;
    auVar22._4_4_ = fVar209 * auVar71._4_4_;
    auVar22._0_4_ = fVar207 * auVar71._0_4_;
    auVar22._8_4_ = fVar211 * auVar71._8_4_;
    auVar22._12_4_ = fVar195 * auVar71._12_4_;
    auVar22._16_4_ = auVar71._16_4_ * 0.0;
    auVar22._20_4_ = auVar71._20_4_ * 0.0;
    auVar22._24_4_ = auVar71._24_4_ * 0.0;
    auVar22._28_4_ = auVar70._28_4_;
    auVar44 = vfmadd231ps_fma(auVar21,auVar72,ZEXT1632(auVar44));
    auVar55 = vfmadd231ps_fma(auVar22,auVar72,ZEXT1632(auVar55));
    auVar123._0_4_ = fVar207 * auVar78._0_4_;
    auVar123._4_4_ = fVar209 * auVar78._4_4_;
    auVar123._8_4_ = fVar211 * auVar78._8_4_;
    auVar123._12_4_ = fVar195 * auVar78._12_4_;
    auVar123._16_4_ = auVar78._16_4_ * 0.0;
    auVar123._20_4_ = auVar78._20_4_ * 0.0;
    auVar123._24_4_ = auVar78._24_4_ * 0.0;
    auVar123._28_4_ = 0;
    auVar23._4_4_ = fVar209 * auVar79._4_4_;
    auVar23._0_4_ = fVar207 * auVar79._0_4_;
    auVar23._8_4_ = fVar211 * auVar79._8_4_;
    auVar23._12_4_ = fVar195 * auVar79._12_4_;
    auVar23._16_4_ = auVar79._16_4_ * 0.0;
    auVar23._20_4_ = auVar79._20_4_ * 0.0;
    auVar23._24_4_ = auVar79._24_4_ * 0.0;
    auVar23._28_4_ = auVar78._28_4_;
    auVar53 = vfmadd231ps_fma(auVar123,auVar72,auVar77);
    auVar54 = vfmadd231ps_fma(auVar23,auVar72,auVar71);
    auVar24._28_4_ = auVar71._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar195 * auVar54._12_4_,
                            CONCAT48(fVar211 * auVar54._8_4_,
                                     CONCAT44(fVar209 * auVar54._4_4_,fVar207 * auVar54._0_4_))));
    auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar195 * auVar53._12_4_,
                                                 CONCAT48(fVar211 * auVar53._8_4_,
                                                          CONCAT44(fVar209 * auVar53._4_4_,
                                                                   fVar207 * auVar53._0_4_)))),
                              auVar72,ZEXT1632(auVar44));
    auVar66 = vfmadd231ps_fma(auVar24,auVar72,ZEXT1632(auVar55));
    auVar70 = vsubps_avx(ZEXT1632(auVar53),ZEXT1632(auVar44));
    auVar77 = vsubps_avx(ZEXT1632(auVar54),ZEXT1632(auVar55));
    auVar71 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar70 = vmulps_avx512vl(auVar70,auVar71);
    auVar77 = vmulps_avx512vl(auVar77,auVar71);
    auVar186._0_4_ = fVar104 * auVar70._0_4_;
    auVar186._4_4_ = fVar104 * auVar70._4_4_;
    auVar186._8_4_ = fVar104 * auVar70._8_4_;
    auVar186._12_4_ = fVar104 * auVar70._12_4_;
    auVar186._16_4_ = fVar104 * auVar70._16_4_;
    auVar186._20_4_ = fVar104 * auVar70._20_4_;
    auVar186._24_4_ = fVar104 * auVar70._24_4_;
    auVar186._28_4_ = 0;
    auVar70 = vmulps_avx512vl(auVar193,auVar77);
    auVar55 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar63),_DAT_01feed00,ZEXT1632(auVar55));
    auVar78 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_01feed00,ZEXT1632(auVar55));
    auVar124._0_4_ = auVar186._0_4_ + auVar63._0_4_;
    auVar124._4_4_ = auVar186._4_4_ + auVar63._4_4_;
    auVar124._8_4_ = auVar186._8_4_ + auVar63._8_4_;
    auVar124._12_4_ = auVar186._12_4_ + auVar63._12_4_;
    auVar124._16_4_ = auVar186._16_4_ + 0.0;
    auVar124._20_4_ = auVar186._20_4_ + 0.0;
    auVar124._24_4_ = auVar186._24_4_ + 0.0;
    auVar124._28_4_ = 0;
    auVar89 = ZEXT1632(auVar55);
    auVar79 = vpermt2ps_avx512vl(auVar186,_DAT_01feed00,auVar89);
    auVar80 = vaddps_avx512vl(ZEXT1632(auVar66),auVar70);
    auVar81 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar89);
    auVar70 = vsubps_avx(auVar77,auVar79);
    auVar79 = vsubps_avx512vl(auVar78,auVar81);
    auVar81 = vmulps_avx512vl(auVar83,auVar86);
    auVar85 = vmulps_avx512vl(auVar87,auVar86);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar72,auVar69);
    auVar69 = vfmadd231ps_avx512vl(auVar85,auVar72,auVar82);
    auVar82 = vmulps_avx512vl(auVar67,auVar86);
    auVar85 = vmulps_avx512vl(auVar88,auVar86);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar72,auVar83);
    auVar87 = vfmadd231ps_avx512vl(auVar85,auVar72,auVar87);
    auVar83 = vmulps_avx512vl(auVar68,auVar86);
    auVar68 = vmulps_avx512vl(auVar84,auVar86);
    auVar44 = vfmadd231ps_fma(auVar83,auVar72,auVar67);
    auVar83 = vfmadd231ps_avx512vl(auVar68,auVar72,auVar88);
    auVar67 = vmulps_avx512vl(auVar86,auVar82);
    auVar84 = ZEXT1632(auVar47);
    auVar68 = vmulps_avx512vl(auVar84,auVar87);
    auVar81 = vfmadd231ps_avx512vl(auVar67,auVar72,auVar81);
    auVar69 = vfmadd231ps_avx512vl(auVar68,auVar72,auVar69);
    auVar83 = vmulps_avx512vl(auVar84,auVar83);
    auVar82 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar195 * auVar44._12_4_,
                                            CONCAT48(fVar211 * auVar44._8_4_,
                                                     CONCAT44(fVar209 * auVar44._4_4_,
                                                              fVar207 * auVar44._0_4_)))),auVar72,
                         auVar82);
    auVar87 = vfmadd231ps_avx512vl(auVar83,auVar72,auVar87);
    auVar25._4_4_ = fVar209 * auVar82._4_4_;
    auVar25._0_4_ = fVar207 * auVar82._0_4_;
    auVar25._8_4_ = fVar211 * auVar82._8_4_;
    auVar25._12_4_ = fVar195 * auVar82._12_4_;
    auVar25._16_4_ = auVar82._16_4_ * 0.0;
    auVar25._20_4_ = auVar82._20_4_ * 0.0;
    auVar25._24_4_ = auVar82._24_4_ * 0.0;
    auVar25._28_4_ = auVar88._28_4_;
    auVar88 = vmulps_avx512vl(auVar84,auVar87);
    auVar83 = vfmadd231ps_avx512vl(auVar25,auVar72,auVar81);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar69,auVar72);
    auVar72 = vsubps_avx512vl(auVar82,auVar81);
    auVar87 = vsubps_avx512vl(auVar87,auVar69);
    auVar72 = vmulps_avx512vl(auVar72,auVar71);
    auVar87 = vmulps_avx512vl(auVar87,auVar71);
    fVar196 = fVar104 * auVar72._0_4_;
    fVar207 = fVar104 * auVar72._4_4_;
    auVar26._4_4_ = fVar207;
    auVar26._0_4_ = fVar196;
    fVar209 = fVar104 * auVar72._8_4_;
    auVar26._8_4_ = fVar209;
    fVar211 = fVar104 * auVar72._12_4_;
    auVar26._12_4_ = fVar211;
    fVar195 = fVar104 * auVar72._16_4_;
    auVar26._16_4_ = fVar195;
    fVar206 = fVar104 * auVar72._20_4_;
    auVar26._20_4_ = fVar206;
    fVar104 = fVar104 * auVar72._24_4_;
    auVar26._24_4_ = fVar104;
    auVar26._28_4_ = auVar72._28_4_;
    auVar87 = vmulps_avx512vl(auVar193,auVar87);
    auVar71 = vpermt2ps_avx512vl(auVar83,_DAT_01feed00,auVar89);
    auVar81 = vpermt2ps_avx512vl(auVar88,_DAT_01feed00,auVar89);
    auVar194._0_4_ = auVar83._0_4_ + fVar196;
    auVar194._4_4_ = auVar83._4_4_ + fVar207;
    auVar194._8_4_ = auVar83._8_4_ + fVar209;
    auVar194._12_4_ = auVar83._12_4_ + fVar211;
    auVar194._16_4_ = auVar83._16_4_ + fVar195;
    auVar194._20_4_ = auVar83._20_4_ + fVar206;
    auVar194._24_4_ = auVar83._24_4_ + fVar104;
    auVar194._28_4_ = auVar83._28_4_ + auVar72._28_4_;
    auVar72 = vpermt2ps_avx512vl(auVar26,_DAT_01feed00,ZEXT1632(auVar55));
    auVar69 = vaddps_avx512vl(auVar88,auVar87);
    in_ZMM16 = ZEXT3264(auVar69);
    auVar87 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,ZEXT1632(auVar55));
    auVar72 = vsubps_avx(auVar71,auVar72);
    auVar87 = vsubps_avx512vl(auVar81,auVar87);
    auVar137 = ZEXT1632(auVar63);
    auVar82 = vsubps_avx512vl(auVar83,auVar137);
    auVar150 = ZEXT1632(auVar66);
    auVar67 = vsubps_avx512vl(auVar88,auVar150);
    auVar68 = vsubps_avx512vl(auVar71,auVar77);
    auVar82 = vaddps_avx512vl(auVar82,auVar68);
    auVar68 = vsubps_avx512vl(auVar81,auVar78);
    auVar67 = vaddps_avx512vl(auVar67,auVar68);
    auVar68 = vmulps_avx512vl(auVar150,auVar82);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar137,auVar67);
    auVar84 = vmulps_avx512vl(auVar80,auVar82);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar124,auVar67);
    auVar85 = vmulps_avx512vl(auVar79,auVar82);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar70,auVar67);
    auVar86 = vmulps_avx512vl(auVar78,auVar82);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar77,auVar67);
    auVar89 = vmulps_avx512vl(auVar88,auVar82);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar83,auVar67);
    auVar90 = vmulps_avx512vl(auVar69,auVar82);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar194,auVar67);
    auVar91 = vmulps_avx512vl(auVar87,auVar82);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar72,auVar67);
    auVar82 = vmulps_avx512vl(auVar81,auVar82);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar71,auVar67);
    auVar67 = vminps_avx512vl(auVar68,auVar84);
    auVar68 = vmaxps_avx512vl(auVar68,auVar84);
    auVar84 = vminps_avx512vl(auVar85,auVar86);
    auVar67 = vminps_avx512vl(auVar67,auVar84);
    auVar84 = vmaxps_avx512vl(auVar85,auVar86);
    auVar68 = vmaxps_avx512vl(auVar68,auVar84);
    auVar84 = vminps_avx512vl(auVar89,auVar90);
    auVar85 = vmaxps_avx512vl(auVar89,auVar90);
    auVar86 = vminps_avx512vl(auVar91,auVar82);
    auVar84 = vminps_avx512vl(auVar84,auVar86);
    auVar67 = vminps_avx512vl(auVar67,auVar84);
    auVar82 = vmaxps_avx512vl(auVar91,auVar82);
    auVar82 = vmaxps_avx512vl(auVar85,auVar82);
    auVar82 = vmaxps_avx512vl(auVar68,auVar82);
    uVar15 = vcmpps_avx512vl(auVar67,local_260,2);
    uVar16 = vcmpps_avx512vl(auVar82,local_280,5);
    bVar33 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar33 != 0) {
      auVar82 = vsubps_avx512vl(auVar77,auVar137);
      auVar67 = vsubps_avx512vl(auVar78,auVar150);
      auVar68 = vsubps_avx512vl(auVar71,auVar83);
      auVar82 = vaddps_avx512vl(auVar82,auVar68);
      auVar68 = vsubps_avx512vl(auVar81,auVar88);
      auVar67 = vaddps_avx512vl(auVar67,auVar68);
      auVar68 = vmulps_avx512vl(auVar150,auVar82);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar67,auVar137);
      auVar80 = vmulps_avx512vl(auVar80,auVar82);
      auVar80 = vfnmadd213ps_avx512vl(auVar124,auVar67,auVar80);
      auVar79 = vmulps_avx512vl(auVar79,auVar82);
      auVar79 = vfnmadd213ps_avx512vl(auVar70,auVar67,auVar79);
      auVar70 = vmulps_avx512vl(auVar78,auVar82);
      auVar78 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar77);
      auVar70 = vmulps_avx512vl(auVar88,auVar82);
      auVar88 = vfnmadd231ps_avx512vl(auVar70,auVar67,auVar83);
      auVar70 = vmulps_avx512vl(auVar69,auVar82);
      auVar69 = vfnmadd213ps_avx512vl(auVar194,auVar67,auVar70);
      auVar70 = vmulps_avx512vl(auVar87,auVar82);
      auVar83 = vfnmadd213ps_avx512vl(auVar72,auVar67,auVar70);
      auVar72 = vmulps_avx512vl(auVar81,auVar82);
      auVar71 = vfnmadd231ps_avx512vl(auVar72,auVar71,auVar67);
      auVar70 = vminps_avx(auVar68,auVar80);
      auVar72 = vmaxps_avx(auVar68,auVar80);
      auVar77 = vminps_avx(auVar79,auVar78);
      auVar77 = vminps_avx(auVar70,auVar77);
      auVar70 = vmaxps_avx(auVar79,auVar78);
      auVar72 = vmaxps_avx(auVar72,auVar70);
      auVar87 = vminps_avx(auVar88,auVar69);
      auVar70 = vmaxps_avx(auVar88,auVar69);
      auVar88 = vminps_avx(auVar83,auVar71);
      auVar87 = vminps_avx(auVar87,auVar88);
      auVar87 = vminps_avx(auVar77,auVar87);
      auVar77 = vmaxps_avx(auVar83,auVar71);
      auVar70 = vmaxps_avx(auVar70,auVar77);
      auVar72 = vmaxps_avx(auVar72,auVar70);
      uVar15 = vcmpps_avx512vl(auVar72,local_280,5);
      uVar16 = vcmpps_avx512vl(auVar87,local_260,2);
      bVar33 = bVar33 & (byte)uVar15 & (byte)uVar16;
      if (bVar33 != 0) {
        auStack_440[uVar28] = (uint)bVar33;
        uVar15 = vmovlps_avx(auVar46);
        (&uStack_240)[uVar28] = uVar15;
        uVar30 = vmovlps_avx(auVar50);
        auStack_1a0[uVar28] = uVar30;
        uVar28 = (ulong)((int)uVar28 + 1);
      }
    }
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT1664(auVar46);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar241 = ZEXT1664(auVar46);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar242 = ZEXT1664(auVar46);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar240 = ZEXT3264(auVar72);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar243 = ZEXT1664(auVar46);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar244 = ZEXT1664(auVar46);
    auVar245 = ZEXT3264(_DAT_01feed20);
LAB_01d03cd6:
    do {
      do {
        if ((int)uVar28 == 0) {
          if (bVar27) {
            return bVar27;
          }
          uVar105 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar20._4_4_ = uVar105;
          auVar20._0_4_ = uVar105;
          auVar20._8_4_ = uVar105;
          auVar20._12_4_ = uVar105;
          auVar20._16_4_ = uVar105;
          auVar20._20_4_ = uVar105;
          auVar20._24_4_ = uVar105;
          auVar20._28_4_ = uVar105;
          uVar15 = vcmpps_avx512vl(local_1c0,auVar20,2);
          uVar37 = (uint)uVar36 & local_468 & (uint)uVar15;
          uVar36 = (ulong)uVar37;
          if (uVar37 == 0) {
            return bVar27;
          }
          goto LAB_01d030df;
        }
        uVar34 = (int)uVar28 - 1;
        uVar35 = (ulong)uVar34;
        uVar6 = auStack_440[uVar35];
        auVar50._8_8_ = 0;
        auVar50._0_8_ = auStack_1a0[uVar35];
        uVar30 = 0;
        for (uVar31 = (ulong)uVar6; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
          uVar30 = uVar30 + 1;
        }
        uVar29 = uVar6 - 1 & uVar6;
        bVar40 = uVar29 == 0;
        auStack_440[uVar35] = uVar29;
        if (bVar40) {
          uVar28 = (ulong)uVar34;
        }
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar30;
        auVar46 = vpunpcklqdq_avx(auVar108,ZEXT416((int)uVar30 + 1));
        auVar46 = vcvtqq2ps_avx512vl(auVar46);
        auVar46 = vmulps_avx512vl(auVar46,auVar243._0_16_);
        uVar105 = *(undefined4 *)((long)&uStack_240 + uVar35 * 8 + 4);
        auVar17._4_4_ = uVar105;
        auVar17._0_4_ = uVar105;
        auVar17._8_4_ = uVar105;
        auVar17._12_4_ = uVar105;
        auVar47 = vmulps_avx512vl(auVar46,auVar17);
        auVar44 = auVar244._0_16_;
        auVar46 = vsubps_avx512vl(auVar44,auVar46);
        uVar105 = *(undefined4 *)(&uStack_240 + uVar35);
        auVar18._4_4_ = uVar105;
        auVar18._0_4_ = uVar105;
        auVar18._8_4_ = uVar105;
        auVar18._12_4_ = uVar105;
        auVar46 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar18);
        auVar47 = vmovshdup_avx(auVar46);
        fVar104 = auVar47._0_4_ - auVar46._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar104));
        if (uVar6 == 0 || bVar40) goto LAB_01d037d9;
        auVar47 = vshufps_avx(auVar50,auVar50,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar104));
        auVar54 = vsubps_avx512vl(auVar44,auVar47);
        fVar196 = auVar47._0_4_;
        auVar145._0_4_ = fVar196 * fVar112;
        fVar207 = auVar47._4_4_;
        auVar145._4_4_ = fVar207 * fVar113;
        fVar209 = auVar47._8_4_;
        auVar145._8_4_ = fVar209 * fVar112;
        fVar211 = auVar47._12_4_;
        auVar145._12_4_ = fVar211 * fVar113;
        auVar154._0_4_ = fVar196 * fVar114;
        auVar154._4_4_ = fVar207 * fVar125;
        auVar154._8_4_ = fVar209 * fVar114;
        auVar154._12_4_ = fVar211 * fVar125;
        auVar159._0_4_ = fVar196 * fVar166;
        auVar159._4_4_ = fVar207 * fVar167;
        auVar159._8_4_ = fVar209 * fVar166;
        auVar159._12_4_ = fVar211 * fVar167;
        auVar127._0_4_ = fVar196 * fVar208;
        auVar127._4_4_ = fVar207 * fVar210;
        auVar127._8_4_ = fVar209 * fVar208;
        auVar127._12_4_ = fVar211 * fVar210;
        auVar47 = vfmadd231ps_fma(auVar145,auVar54,auVar52);
        auVar55 = vfmadd231ps_fma(auVar154,auVar54,auVar43);
        auVar53 = vfmadd231ps_fma(auVar159,auVar54,auVar170);
        auVar54 = vfmadd231ps_fma(auVar127,auVar54,auVar177);
        auVar138._16_16_ = auVar47;
        auVar138._0_16_ = auVar47;
        auVar151._16_16_ = auVar55;
        auVar151._0_16_ = auVar55;
        auVar158._16_16_ = auVar53;
        auVar158._0_16_ = auVar53;
        auVar70 = vpermps_avx512vl(auVar245._0_32_,ZEXT1632(auVar46));
        auVar72 = vsubps_avx(auVar151,auVar138);
        auVar55 = vfmadd213ps_fma(auVar72,auVar70,auVar138);
        auVar72 = vsubps_avx(auVar158,auVar151);
        auVar63 = vfmadd213ps_fma(auVar72,auVar70,auVar151);
        auVar47 = vsubps_avx(auVar54,auVar53);
        auVar152._16_16_ = auVar47;
        auVar152._0_16_ = auVar47;
        auVar47 = vfmadd213ps_fma(auVar152,auVar70,auVar158);
        auVar72 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar55));
        auVar55 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar55));
        auVar72 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar63));
        auVar47 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar63));
        auVar72 = vsubps_avx(ZEXT1632(auVar47),ZEXT1632(auVar55));
        auVar117 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar72,auVar70);
        auVar72 = vmulps_avx512vl(auVar72,auVar240._0_32_);
        auVar93._16_16_ = auVar72._16_16_;
        fVar196 = fVar104 * 0.33333334;
        auVar160._0_8_ =
             CONCAT44(auVar117._4_4_ + fVar196 * auVar72._4_4_,
                      auVar117._0_4_ + fVar196 * auVar72._0_4_);
        auVar160._8_4_ = auVar117._8_4_ + fVar196 * auVar72._8_4_;
        auVar160._12_4_ = auVar117._12_4_ + fVar196 * auVar72._12_4_;
        auVar146._0_4_ = fVar196 * auVar72._16_4_;
        auVar146._4_4_ = fVar196 * auVar72._20_4_;
        auVar146._8_4_ = fVar196 * auVar72._24_4_;
        auVar146._12_4_ = fVar196 * auVar72._28_4_;
        auVar62 = vsubps_avx((undefined1  [16])0x0,auVar146);
        auVar63 = vshufpd_avx(auVar117,auVar117,3);
        auVar66 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar47 = vsubps_avx(auVar63,auVar117);
        auVar55 = vsubps_avx(auVar66,(undefined1  [16])0x0);
        auVar178._0_4_ = auVar47._0_4_ + auVar55._0_4_;
        auVar178._4_4_ = auVar47._4_4_ + auVar55._4_4_;
        auVar178._8_4_ = auVar47._8_4_ + auVar55._8_4_;
        auVar178._12_4_ = auVar47._12_4_ + auVar55._12_4_;
        auVar47 = vshufps_avx(auVar117,auVar117,0xb1);
        auVar55 = vshufps_avx(auVar160,auVar160,0xb1);
        auVar53 = vshufps_avx(auVar62,auVar62,0xb1);
        auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar229._4_4_ = auVar178._0_4_;
        auVar229._0_4_ = auVar178._0_4_;
        auVar229._8_4_ = auVar178._0_4_;
        auVar229._12_4_ = auVar178._0_4_;
        auVar58 = vshufps_avx(auVar178,auVar178,0x55);
        fVar196 = auVar58._0_4_;
        auVar190._0_4_ = auVar47._0_4_ * fVar196;
        fVar207 = auVar58._4_4_;
        auVar190._4_4_ = auVar47._4_4_ * fVar207;
        fVar209 = auVar58._8_4_;
        auVar190._8_4_ = auVar47._8_4_ * fVar209;
        fVar211 = auVar58._12_4_;
        auVar190._12_4_ = auVar47._12_4_ * fVar211;
        auVar198._0_4_ = auVar55._0_4_ * fVar196;
        auVar198._4_4_ = auVar55._4_4_ * fVar207;
        auVar198._8_4_ = auVar55._8_4_ * fVar209;
        auVar198._12_4_ = auVar55._12_4_ * fVar211;
        auVar214._0_4_ = auVar53._0_4_ * fVar196;
        auVar214._4_4_ = auVar53._4_4_ * fVar207;
        auVar214._8_4_ = auVar53._8_4_ * fVar209;
        auVar214._12_4_ = auVar53._12_4_ * fVar211;
        auVar179._0_4_ = auVar54._0_4_ * fVar196;
        auVar179._4_4_ = auVar54._4_4_ * fVar207;
        auVar179._8_4_ = auVar54._8_4_ * fVar209;
        auVar179._12_4_ = auVar54._12_4_ * fVar211;
        auVar47 = vfmadd231ps_fma(auVar190,auVar229,auVar117);
        auVar55 = vfmadd231ps_fma(auVar198,auVar229,auVar160);
        auVar60 = vfmadd231ps_fma(auVar214,auVar229,auVar62);
        auVar61 = vfmadd231ps_fma(auVar179,(undefined1  [16])0x0,auVar229);
        auVar58 = vshufpd_avx(auVar47,auVar47,1);
        auVar59 = vshufpd_avx(auVar55,auVar55,1);
        auVar56 = vshufpd_avx512vl(auVar60,auVar60,1);
        auVar57 = vshufpd_avx512vl(auVar61,auVar61,1);
        auVar53 = vminss_avx(auVar47,auVar55);
        auVar47 = vmaxss_avx(auVar55,auVar47);
        auVar54 = vminss_avx(auVar60,auVar61);
        auVar55 = vmaxss_avx(auVar61,auVar60);
        auVar53 = vminss_avx(auVar53,auVar54);
        auVar47 = vmaxss_avx(auVar55,auVar47);
        auVar54 = vminss_avx(auVar58,auVar59);
        auVar55 = vmaxss_avx(auVar59,auVar58);
        auVar58 = vminss_avx512f(auVar56,auVar57);
        auVar59 = vmaxss_avx512f(auVar57,auVar56);
        auVar55 = vmaxss_avx(auVar59,auVar55);
        auVar54 = vminss_avx512f(auVar54,auVar58);
        in_ZMM16 = ZEXT1664(auVar54);
        fVar207 = auVar55._0_4_;
        fVar196 = auVar47._0_4_;
        if (auVar53._0_4_ < 0.0001) {
          bVar41 = fVar207 == -0.0001;
          bVar38 = NAN(fVar207);
          if (fVar207 <= -0.0001) goto LAB_01d03f02;
          break;
        }
LAB_01d03f02:
        vucomiss_avx512f(auVar54);
        bVar41 = fVar207 <= -0.0001;
        bVar39 = -0.0001 < fVar196;
        bVar38 = bVar41;
        if (!bVar41) break;
        uVar30 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        uVar31 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),5);
        bVar11 = (uVar30 & uVar31 & 1) == 0;
        bVar41 = bVar39 && bVar11;
        bVar38 = bVar39 && (uVar30 & uVar31 & 1) == 0;
      } while (!bVar39 || !bVar11);
      auVar60 = auVar247._0_16_;
      vcmpss_avx512f(auVar53,auVar60,1);
      uVar15 = vcmpss_avx512f(auVar47,auVar60,1);
      bVar39 = (bool)((byte)uVar15 & 1);
      auVar93._0_16_ = auVar248._0_16_;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (float)((uint)bVar39 * -0x40800000 + (uint)!bVar39 * auVar248._0_4_);
      vucomiss_avx512f(auVar92._0_16_);
      bVar38 = (bool)(!bVar41 | bVar38);
      bVar39 = bVar38 == false;
      auVar95._16_16_ = auVar93._16_16_;
      auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar38 * auVar247._0_4_ + (uint)!bVar38 * 0x7f800000;
      auVar59 = auVar94._0_16_;
      auVar97._16_16_ = auVar93._16_16_;
      auVar97._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar96._4_28_ = auVar97._4_28_;
      auVar96._0_4_ = (uint)bVar38 * auVar247._0_4_ + (uint)!bVar38 * -0x800000;
      auVar58 = auVar96._0_16_;
      uVar15 = vcmpss_avx512f(auVar54,auVar60,1);
      bVar41 = (bool)((byte)uVar15 & 1);
      auVar99._16_16_ = auVar93._16_16_;
      auVar99._0_16_ = auVar248._0_16_;
      auVar98._4_28_ = auVar99._4_28_;
      auVar98._0_4_ = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * auVar248._0_4_);
      vucomiss_avx512f(auVar98._0_16_);
      if ((bVar38) || (bVar39)) {
        auVar54 = vucomiss_avx512f(auVar53);
        if ((bVar38) || (bVar39)) {
          auVar61 = vxorps_avx512vl(auVar53,auVar242._0_16_);
          auVar53 = vsubss_avx512f(auVar54,auVar53);
          auVar53 = vdivss_avx512f(auVar61,auVar53);
          auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
          auVar53 = vfmadd213ss_avx512f(auVar54,auVar60,auVar53);
          in_ZMM16 = ZEXT1664(auVar53);
        }
        else {
          auVar53 = vxorps_avx512vl(auVar54,auVar54);
          in_ZMM16 = ZEXT1664(auVar53);
          vucomiss_avx512f(auVar53);
          auVar53 = ZEXT416(0x3f800000);
          if ((bVar38) || (bVar39)) {
            in_ZMM16 = ZEXT464(0x7f800000);
            auVar53 = SUB6416(ZEXT464(0xff800000),0);
          }
        }
        auVar59 = vminss_avx512f(auVar59,in_ZMM16._0_16_);
        auVar58 = vmaxss_avx(auVar53,auVar58);
      }
      auVar248 = ZEXT464(0x3f800000);
      uVar15 = vcmpss_avx512f(auVar55,auVar60,1);
      bVar41 = (bool)((byte)uVar15 & 1);
      auVar55 = auVar248._0_16_;
      fVar209 = (float)((uint)bVar41 * -0x40800000 + (uint)!bVar41 * 0x3f800000);
      if ((auVar92._0_4_ != fVar209) || (NAN(auVar92._0_4_) || NAN(fVar209))) {
        if ((fVar207 != fVar196) || (NAN(fVar207) || NAN(fVar196))) {
          auVar47 = vxorps_avx512vl(auVar47,auVar242._0_16_);
          auVar180._0_4_ = auVar47._0_4_ / (fVar207 - fVar196);
          auVar180._4_12_ = auVar47._4_12_;
          auVar47 = vsubss_avx512f(auVar55,auVar180);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar60,auVar180);
          auVar53 = auVar47;
        }
        else if ((fVar196 != 0.0) ||
                (auVar47 = auVar55, auVar53 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar196))) {
          auVar47 = SUB6416(ZEXT464(0xff800000),0);
          auVar53 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar59 = vminss_avx(auVar59,auVar53);
        auVar58 = vmaxss_avx(auVar47,auVar58);
      }
      bVar41 = auVar98._0_4_ != fVar209;
      auVar47 = vminss_avx512f(auVar59,auVar55);
      auVar101._16_16_ = auVar93._16_16_;
      auVar101._0_16_ = auVar59;
      auVar100._4_28_ = auVar101._4_28_;
      auVar100._0_4_ = (uint)bVar41 * auVar47._0_4_ + (uint)!bVar41 * auVar59._0_4_;
      auVar47 = vmaxss_avx512f(auVar55,auVar58);
      auVar103._16_16_ = auVar93._16_16_;
      auVar103._0_16_ = auVar58;
      auVar102._4_28_ = auVar103._4_28_;
      auVar102._0_4_ = (uint)bVar41 * auVar47._0_4_ + (uint)!bVar41 * auVar58._0_4_;
      auVar47 = vmaxss_avx512f(auVar60,auVar100._0_16_);
      auVar53 = vminss_avx512f(auVar102._0_16_,auVar55);
    } while (auVar53._0_4_ < auVar47._0_4_);
    auVar60 = vmaxss_avx512f(auVar60,ZEXT416((uint)(auVar47._0_4_ + -0.1)));
    auVar61 = vminss_avx512f(ZEXT416((uint)(auVar53._0_4_ + 0.1)),auVar55);
    auVar128._0_8_ = auVar117._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar199._8_8_ = auVar160._0_8_;
    auVar199._0_8_ = auVar160._0_8_;
    auVar215._8_8_ = auVar62._0_8_;
    auVar215._0_8_ = auVar62._0_8_;
    auVar47 = vshufpd_avx(auVar160,auVar160,3);
    auVar53 = vshufpd_avx(auVar62,auVar62,3);
    auVar54 = vshufps_avx(auVar60,auVar61,0);
    auVar59 = vsubps_avx512vl(auVar44,auVar54);
    fVar196 = auVar54._0_4_;
    auVar155._0_4_ = fVar196 * auVar63._0_4_;
    fVar207 = auVar54._4_4_;
    auVar155._4_4_ = fVar207 * auVar63._4_4_;
    fVar209 = auVar54._8_4_;
    auVar155._8_4_ = fVar209 * auVar63._8_4_;
    fVar211 = auVar54._12_4_;
    auVar155._12_4_ = fVar211 * auVar63._12_4_;
    auVar161._0_4_ = fVar196 * auVar47._0_4_;
    auVar161._4_4_ = fVar207 * auVar47._4_4_;
    auVar161._8_4_ = fVar209 * auVar47._8_4_;
    auVar161._12_4_ = fVar211 * auVar47._12_4_;
    auVar233._0_4_ = auVar53._0_4_ * fVar196;
    auVar233._4_4_ = auVar53._4_4_ * fVar207;
    auVar233._8_4_ = auVar53._8_4_ * fVar209;
    auVar233._12_4_ = auVar53._12_4_ * fVar211;
    auVar147._0_4_ = fVar196 * auVar66._0_4_;
    auVar147._4_4_ = fVar207 * auVar66._4_4_;
    auVar147._8_4_ = fVar209 * auVar66._8_4_;
    auVar147._12_4_ = fVar211 * auVar66._12_4_;
    auVar63 = vfmadd231ps_fma(auVar155,auVar59,auVar128);
    auVar66 = vfmadd231ps_fma(auVar161,auVar59,auVar199);
    auVar58 = vfmadd231ps_fma(auVar233,auVar59,auVar215);
    auVar59 = vfmadd231ps_fma(auVar147,auVar59,ZEXT816(0));
    auVar53 = vsubss_avx512f(auVar55,auVar60);
    auVar47 = vmovshdup_avx(auVar50);
    auVar117 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar60._0_4_)),auVar50,auVar53);
    auVar53 = vsubss_avx512f(auVar55,auVar61);
    auVar56 = vfmadd231ss_fma(ZEXT416((uint)(auVar47._0_4_ * auVar61._0_4_)),auVar50,auVar53);
    auVar62 = vdivss_avx512f(auVar55,ZEXT416((uint)fVar104));
    auVar47 = vsubps_avx(auVar66,auVar63);
    auVar133 = auVar239._0_16_;
    auVar53 = vmulps_avx512vl(auVar47,auVar133);
    auVar47 = vsubps_avx(auVar58,auVar66);
    auVar54 = vmulps_avx512vl(auVar47,auVar133);
    auVar47 = vsubps_avx(auVar59,auVar58);
    auVar47 = vmulps_avx512vl(auVar47,auVar133);
    auVar50 = vminps_avx(auVar54,auVar47);
    auVar47 = vmaxps_avx(auVar54,auVar47);
    auVar50 = vminps_avx(auVar53,auVar50);
    auVar47 = vmaxps_avx(auVar53,auVar47);
    auVar53 = vshufpd_avx(auVar50,auVar50,3);
    auVar54 = vshufpd_avx(auVar47,auVar47,3);
    auVar50 = vminps_avx(auVar50,auVar53);
    auVar47 = vmaxps_avx(auVar47,auVar54);
    fVar104 = auVar62._0_4_;
    auVar181._0_4_ = auVar50._0_4_ * fVar104;
    auVar181._4_4_ = auVar50._4_4_ * fVar104;
    auVar181._8_4_ = auVar50._8_4_ * fVar104;
    auVar181._12_4_ = auVar50._12_4_ * fVar104;
    auVar171._0_4_ = fVar104 * auVar47._0_4_;
    auVar171._4_4_ = fVar104 * auVar47._4_4_;
    auVar171._8_4_ = fVar104 * auVar47._8_4_;
    auVar171._12_4_ = fVar104 * auVar47._12_4_;
    auVar62 = vdivss_avx512f(auVar55,ZEXT416((uint)(auVar56._0_4_ - auVar117._0_4_)));
    auVar47 = vshufpd_avx(auVar63,auVar63,3);
    auVar50 = vshufpd_avx(auVar66,auVar66,3);
    auVar53 = vshufpd_avx(auVar58,auVar58,3);
    auVar54 = vshufpd_avx(auVar59,auVar59,3);
    auVar47 = vsubps_avx(auVar47,auVar63);
    auVar63 = vsubps_avx(auVar50,auVar66);
    auVar66 = vsubps_avx(auVar53,auVar58);
    auVar54 = vsubps_avx(auVar54,auVar59);
    auVar50 = vminps_avx(auVar47,auVar63);
    auVar47 = vmaxps_avx(auVar47,auVar63);
    auVar53 = vminps_avx(auVar66,auVar54);
    auVar53 = vminps_avx(auVar50,auVar53);
    auVar50 = vmaxps_avx(auVar66,auVar54);
    auVar47 = vmaxps_avx(auVar47,auVar50);
    fVar104 = auVar62._0_4_;
    auVar216._0_4_ = fVar104 * auVar53._0_4_;
    auVar216._4_4_ = fVar104 * auVar53._4_4_;
    auVar216._8_4_ = fVar104 * auVar53._8_4_;
    auVar216._12_4_ = fVar104 * auVar53._12_4_;
    auVar200._0_4_ = fVar104 * auVar47._0_4_;
    auVar200._4_4_ = fVar104 * auVar47._4_4_;
    auVar200._8_4_ = fVar104 * auVar47._8_4_;
    auVar200._12_4_ = fVar104 * auVar47._12_4_;
    auVar54 = vinsertps_avx(auVar46,auVar117,0x10);
    auVar57 = vpermt2ps_avx512vl(auVar46,_DAT_01feecd0,auVar56);
    auVar116._0_4_ = auVar54._0_4_ + auVar57._0_4_;
    auVar116._4_4_ = auVar54._4_4_ + auVar57._4_4_;
    auVar116._8_4_ = auVar54._8_4_ + auVar57._8_4_;
    auVar116._12_4_ = auVar54._12_4_ + auVar57._12_4_;
    auVar19._8_4_ = 0x3f000000;
    auVar19._0_8_ = 0x3f0000003f000000;
    auVar19._12_4_ = 0x3f000000;
    auVar62 = vmulps_avx512vl(auVar116,auVar19);
    auVar50 = vshufps_avx(auVar62,auVar62,0x54);
    uVar105 = auVar62._0_4_;
    auVar119._4_4_ = uVar105;
    auVar119._0_4_ = uVar105;
    auVar119._8_4_ = uVar105;
    auVar119._12_4_ = uVar105;
    auVar53 = vfmadd213ps_fma(auVar42,auVar119,auVar3);
    auVar63 = vfmadd213ps_fma(local_290,auVar119,auVar51);
    auVar66 = vfmadd213ps_fma(local_2a0,auVar119,auVar48);
    auVar47 = vsubps_avx(auVar63,auVar53);
    auVar53 = vfmadd213ps_fma(auVar47,auVar119,auVar53);
    auVar47 = vsubps_avx(auVar66,auVar63);
    auVar47 = vfmadd213ps_fma(auVar47,auVar119,auVar63);
    auVar47 = vsubps_avx(auVar47,auVar53);
    auVar53 = vfmadd231ps_fma(auVar53,auVar47,auVar119);
    auVar58 = vmulps_avx512vl(auVar47,auVar133);
    auVar224._8_8_ = auVar53._0_8_;
    auVar224._0_8_ = auVar53._0_8_;
    auVar47 = vshufpd_avx(auVar53,auVar53,3);
    auVar53 = vshufps_avx(auVar62,auVar62,0x55);
    auVar63 = vsubps_avx(auVar47,auVar224);
    auVar66 = vfmadd231ps_fma(auVar224,auVar53,auVar63);
    auVar234._8_8_ = auVar58._0_8_;
    auVar234._0_8_ = auVar58._0_8_;
    auVar47 = vshufpd_avx(auVar58,auVar58,3);
    auVar47 = vsubps_avx512vl(auVar47,auVar234);
    auVar47 = vfmadd213ps_avx512vl(auVar47,auVar53,auVar234);
    auVar120._0_8_ = auVar63._0_8_ ^ 0x8000000080000000;
    auVar120._8_4_ = auVar63._8_4_ ^ 0x80000000;
    auVar120._12_4_ = auVar63._12_4_ ^ 0x80000000;
    auVar53 = vmovshdup_avx512vl(auVar47);
    auVar235._0_8_ = auVar53._0_8_ ^ 0x8000000080000000;
    auVar235._8_4_ = auVar53._8_4_ ^ 0x80000000;
    auVar235._12_4_ = auVar53._12_4_ ^ 0x80000000;
    auVar58 = vmovshdup_avx512vl(auVar63);
    auVar59 = vpermt2ps_avx512vl(auVar235,ZEXT416(5),auVar63);
    auVar53 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar53._0_4_ * auVar63._0_4_)),auVar47,auVar58);
    auVar63 = vpermt2ps_avx512vl(auVar47,SUB6416(ZEXT464(4),0),auVar120);
    auVar148._0_4_ = auVar53._0_4_;
    auVar148._4_4_ = auVar148._0_4_;
    auVar148._8_4_ = auVar148._0_4_;
    auVar148._12_4_ = auVar148._0_4_;
    auVar47 = vdivps_avx(auVar59,auVar148);
    auVar64 = vdivps_avx512vl(auVar63,auVar148);
    fVar104 = auVar66._0_4_;
    auVar53 = vshufps_avx(auVar66,auVar66,0x55);
    auVar225._0_4_ = fVar104 * auVar47._0_4_ + auVar53._0_4_ * auVar64._0_4_;
    auVar225._4_4_ = fVar104 * auVar47._4_4_ + auVar53._4_4_ * auVar64._4_4_;
    auVar225._8_4_ = fVar104 * auVar47._8_4_ + auVar53._8_4_ * auVar64._8_4_;
    auVar225._12_4_ = fVar104 * auVar47._12_4_ + auVar53._12_4_ * auVar64._12_4_;
    auVar60 = vsubps_avx(auVar50,auVar225);
    auVar53 = vmovshdup_avx(auVar47);
    auVar50 = vinsertps_avx(auVar181,auVar216,0x1c);
    auVar236._0_4_ = auVar53._0_4_ * auVar50._0_4_;
    auVar236._4_4_ = auVar53._4_4_ * auVar50._4_4_;
    auVar236._8_4_ = auVar53._8_4_ * auVar50._8_4_;
    auVar236._12_4_ = auVar53._12_4_ * auVar50._12_4_;
    auVar61 = vinsertps_avx512f(auVar171,auVar200,0x1c);
    auVar53 = vmulps_avx512vl(auVar53,auVar61);
    auVar59 = vminps_avx512vl(auVar236,auVar53);
    auVar66 = vmaxps_avx(auVar53,auVar236);
    auVar58 = vmovshdup_avx(auVar64);
    auVar53 = vinsertps_avx(auVar216,auVar181,0x4c);
    auVar217._0_4_ = auVar58._0_4_ * auVar53._0_4_;
    auVar217._4_4_ = auVar58._4_4_ * auVar53._4_4_;
    auVar217._8_4_ = auVar58._8_4_ * auVar53._8_4_;
    auVar217._12_4_ = auVar58._12_4_ * auVar53._12_4_;
    auVar63 = vinsertps_avx(auVar200,auVar171,0x4c);
    auVar201._0_4_ = auVar58._0_4_ * auVar63._0_4_;
    auVar201._4_4_ = auVar58._4_4_ * auVar63._4_4_;
    auVar201._8_4_ = auVar58._8_4_ * auVar63._8_4_;
    auVar201._12_4_ = auVar58._12_4_ * auVar63._12_4_;
    auVar58 = vminps_avx(auVar217,auVar201);
    auVar59 = vaddps_avx512vl(auVar59,auVar58);
    auVar58 = vmaxps_avx(auVar201,auVar217);
    auVar202._0_4_ = auVar66._0_4_ + auVar58._0_4_;
    auVar202._4_4_ = auVar66._4_4_ + auVar58._4_4_;
    auVar202._8_4_ = auVar66._8_4_ + auVar58._8_4_;
    auVar202._12_4_ = auVar66._12_4_ + auVar58._12_4_;
    auVar218._8_8_ = 0x3f80000000000000;
    auVar218._0_8_ = 0x3f80000000000000;
    auVar66 = vsubps_avx(auVar218,auVar202);
    auVar58 = vsubps_avx(auVar218,auVar59);
    auVar59 = vsubps_avx(auVar54,auVar62);
    auVar62 = vsubps_avx(auVar57,auVar62);
    fVar211 = auVar59._0_4_;
    auVar237._0_4_ = fVar211 * auVar66._0_4_;
    fVar195 = auVar59._4_4_;
    auVar237._4_4_ = fVar195 * auVar66._4_4_;
    fVar206 = auVar59._8_4_;
    auVar237._8_4_ = fVar206 * auVar66._8_4_;
    fVar212 = auVar59._12_4_;
    auVar237._12_4_ = fVar212 * auVar66._12_4_;
    auVar65 = vbroadcastss_avx512vl(auVar47);
    auVar50 = vmulps_avx512vl(auVar65,auVar50);
    auVar61 = vmulps_avx512vl(auVar65,auVar61);
    auVar65 = vminps_avx512vl(auVar50,auVar61);
    auVar61 = vmaxps_avx512vl(auVar61,auVar50);
    auVar50 = vbroadcastss_avx512vl(auVar64);
    auVar53 = vmulps_avx512vl(auVar50,auVar53);
    auVar50 = vmulps_avx512vl(auVar50,auVar63);
    auVar63 = vminps_avx512vl(auVar53,auVar50);
    auVar63 = vaddps_avx512vl(auVar65,auVar63);
    auVar59 = vmulps_avx512vl(auVar59,auVar58);
    fVar104 = auVar62._0_4_;
    auVar203._0_4_ = fVar104 * auVar66._0_4_;
    fVar196 = auVar62._4_4_;
    auVar203._4_4_ = fVar196 * auVar66._4_4_;
    fVar207 = auVar62._8_4_;
    auVar203._8_4_ = fVar207 * auVar66._8_4_;
    fVar209 = auVar62._12_4_;
    auVar203._12_4_ = fVar209 * auVar66._12_4_;
    auVar219._0_4_ = fVar104 * auVar58._0_4_;
    auVar219._4_4_ = fVar196 * auVar58._4_4_;
    auVar219._8_4_ = fVar207 * auVar58._8_4_;
    auVar219._12_4_ = fVar209 * auVar58._12_4_;
    auVar50 = vmaxps_avx(auVar50,auVar53);
    auVar172._0_4_ = auVar61._0_4_ + auVar50._0_4_;
    auVar172._4_4_ = auVar61._4_4_ + auVar50._4_4_;
    auVar172._8_4_ = auVar61._8_4_ + auVar50._8_4_;
    auVar172._12_4_ = auVar61._12_4_ + auVar50._12_4_;
    auVar182._8_8_ = 0x3f800000;
    auVar182._0_8_ = 0x3f800000;
    auVar50 = vsubps_avx(auVar182,auVar172);
    auVar53 = vsubps_avx512vl(auVar182,auVar63);
    auVar230._0_4_ = fVar211 * auVar50._0_4_;
    auVar230._4_4_ = fVar195 * auVar50._4_4_;
    auVar230._8_4_ = fVar206 * auVar50._8_4_;
    auVar230._12_4_ = fVar212 * auVar50._12_4_;
    auVar226._0_4_ = fVar211 * auVar53._0_4_;
    auVar226._4_4_ = fVar195 * auVar53._4_4_;
    auVar226._8_4_ = fVar206 * auVar53._8_4_;
    auVar226._12_4_ = fVar212 * auVar53._12_4_;
    auVar173._0_4_ = fVar104 * auVar50._0_4_;
    auVar173._4_4_ = fVar196 * auVar50._4_4_;
    auVar173._8_4_ = fVar207 * auVar50._8_4_;
    auVar173._12_4_ = fVar209 * auVar50._12_4_;
    auVar183._0_4_ = fVar104 * auVar53._0_4_;
    auVar183._4_4_ = fVar196 * auVar53._4_4_;
    auVar183._8_4_ = fVar207 * auVar53._8_4_;
    auVar183._12_4_ = fVar209 * auVar53._12_4_;
    auVar50 = vminps_avx(auVar230,auVar226);
    auVar53 = vminps_avx512vl(auVar173,auVar183);
    in_ZMM16 = ZEXT1664(auVar53);
    auVar63 = vminps_avx512vl(auVar50,auVar53);
    auVar50 = vmaxps_avx(auVar226,auVar230);
    auVar53 = vmaxps_avx(auVar183,auVar173);
    auVar53 = vmaxps_avx(auVar53,auVar50);
    auVar66 = vminps_avx512vl(auVar237,auVar59);
    auVar50 = vminps_avx(auVar203,auVar219);
    auVar50 = vminps_avx(auVar66,auVar50);
    auVar50 = vhaddps_avx(auVar63,auVar50);
    auVar66 = vmaxps_avx512vl(auVar59,auVar237);
    auVar63 = vmaxps_avx(auVar219,auVar203);
    auVar63 = vmaxps_avx(auVar63,auVar66);
    auVar53 = vhaddps_avx(auVar53,auVar63);
    auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
    auVar53 = vshufps_avx(auVar53,auVar53,0xe8);
    auVar174._0_4_ = auVar50._0_4_ + auVar60._0_4_;
    auVar174._4_4_ = auVar50._4_4_ + auVar60._4_4_;
    auVar174._8_4_ = auVar50._8_4_ + auVar60._8_4_;
    auVar174._12_4_ = auVar50._12_4_ + auVar60._12_4_;
    auVar184._0_4_ = auVar53._0_4_ + auVar60._0_4_;
    auVar184._4_4_ = auVar53._4_4_ + auVar60._4_4_;
    auVar184._8_4_ = auVar53._8_4_ + auVar60._8_4_;
    auVar184._12_4_ = auVar53._12_4_ + auVar60._12_4_;
    auVar50 = vmaxps_avx(auVar54,auVar174);
    auVar53 = vminps_avx(auVar184,auVar57);
    uVar30 = vcmpps_avx512vl(auVar53,auVar50,1);
    auVar50 = ZEXT416(5);
    if ((uVar30 & 3) != 0) {
      auVar46 = vxorps_avx512vl(ZEXT416(5),auVar50);
      auVar247 = ZEXT1664(auVar46);
      goto LAB_01d03cd6;
    }
    uVar30 = vcmpps_avx512vl(auVar184,auVar57,1);
    uVar15 = vcmpps_avx512vl(auVar46,auVar174,1);
    if (((ushort)uVar15 & (ushort)uVar30 & 1) == 0) {
      bVar33 = 0;
    }
    else {
      auVar53 = vmovshdup_avx(auVar174);
      bVar33 = auVar117._0_4_ < auVar53._0_4_ & (byte)(uVar30 >> 1) & 0x7f;
    }
    auVar50 = vxorps_avx512vl(auVar50,auVar50);
    auVar247 = ZEXT1664(auVar50);
    local_450 = auVar49._0_4_;
    fStack_44c = auVar49._4_4_;
    fStack_448 = auVar49._8_4_;
    fStack_444 = auVar49._12_4_;
    if (((3 < (uint)uVar28 || uVar6 != 0 && !bVar40) | bVar33) == 1) {
      lVar32 = 200;
      do {
        auVar46 = vsubss_avx512f(auVar55,auVar60);
        fVar207 = auVar46._0_4_;
        fVar104 = fVar207 * fVar207 * fVar207;
        fVar209 = auVar60._0_4_;
        fVar196 = fVar209 * 3.0 * fVar207 * fVar207;
        fVar207 = fVar207 * fVar209 * fVar209 * 3.0;
        auVar135._4_4_ = fVar104;
        auVar135._0_4_ = fVar104;
        auVar135._8_4_ = fVar104;
        auVar135._12_4_ = fVar104;
        auVar129._4_4_ = fVar196;
        auVar129._0_4_ = fVar196;
        auVar129._8_4_ = fVar196;
        auVar129._12_4_ = fVar196;
        auVar109._4_4_ = fVar207;
        auVar109._0_4_ = fVar207;
        auVar109._8_4_ = fVar207;
        auVar109._12_4_ = fVar207;
        fVar209 = fVar209 * fVar209 * fVar209;
        auVar156._0_4_ = local_450 * fVar209;
        auVar156._4_4_ = fStack_44c * fVar209;
        auVar156._8_4_ = fStack_448 * fVar209;
        auVar156._12_4_ = fStack_444 * fVar209;
        auVar46 = vfmadd231ps_fma(auVar156,auVar48,auVar109);
        auVar46 = vfmadd231ps_fma(auVar46,auVar51,auVar129);
        auVar46 = vfmadd231ps_fma(auVar46,auVar3,auVar135);
        auVar110._8_8_ = auVar46._0_8_;
        auVar110._0_8_ = auVar46._0_8_;
        auVar46 = vshufpd_avx(auVar46,auVar46,3);
        auVar53 = vshufps_avx(auVar60,auVar60,0x55);
        auVar46 = vsubps_avx(auVar46,auVar110);
        auVar53 = vfmadd213ps_fma(auVar46,auVar53,auVar110);
        fVar104 = auVar53._0_4_;
        auVar46 = vshufps_avx(auVar53,auVar53,0x55);
        auVar111._0_4_ = auVar47._0_4_ * fVar104 + auVar64._0_4_ * auVar46._0_4_;
        auVar111._4_4_ = auVar47._4_4_ * fVar104 + auVar64._4_4_ * auVar46._4_4_;
        auVar111._8_4_ = auVar47._8_4_ * fVar104 + auVar64._8_4_ * auVar46._8_4_;
        auVar111._12_4_ = auVar47._12_4_ * fVar104 + auVar64._12_4_ * auVar46._12_4_;
        auVar60 = vsubps_avx(auVar60,auVar111);
        auVar46 = vandps_avx512vl(auVar53,auVar241._0_16_);
        auVar53 = vprolq_avx512vl(auVar46,0x20);
        auVar46 = vmaxss_avx(auVar53,auVar46);
        bVar40 = auVar46._0_4_ <= fVar126;
        if (auVar46._0_4_ < fVar126) {
          auVar46 = vucomiss_avx512f(auVar50);
          if (bVar40) {
            auVar47 = vucomiss_avx512f(auVar46);
            auVar248 = ZEXT1664(auVar47);
            if (bVar40) {
              vmovshdup_avx(auVar46);
              auVar47 = vucomiss_avx512f(auVar50);
              if (bVar40) {
                auVar55 = vucomiss_avx512f(auVar47);
                auVar248 = ZEXT1664(auVar55);
                if (bVar40) {
                  auVar53 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar60 = vinsertps_avx(auVar53,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar53 = vdpps_avx(auVar60,local_2b0,0x7f);
                  auVar54 = vdpps_avx(auVar60,local_2c0,0x7f);
                  auVar63 = vdpps_avx(auVar60,local_2d0,0x7f);
                  auVar66 = vdpps_avx(auVar60,local_2e0,0x7f);
                  auVar58 = vdpps_avx(auVar60,local_2f0,0x7f);
                  auVar59 = vdpps_avx(auVar60,local_300,0x7f);
                  auVar62 = vdpps_avx(auVar60,local_310,0x7f);
                  auVar60 = vdpps_avx(auVar60,local_320,0x7f);
                  auVar61 = vsubss_avx512f(auVar55,auVar47);
                  fVar104 = auVar47._0_4_;
                  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar58._0_4_)),auVar61,auVar53
                                           );
                  auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar104)),auVar61,auVar54
                                           );
                  auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar62._0_4_ * fVar104)),auVar61,auVar63
                                           );
                  auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar60._0_4_)),auVar61,auVar66
                                           );
                  auVar55 = vsubss_avx512f(auVar55,auVar46);
                  auVar157._0_4_ = auVar55._0_4_;
                  fVar104 = auVar157._0_4_ * auVar157._0_4_ * auVar157._0_4_;
                  local_120 = auVar46._0_4_;
                  fVar196 = local_120 * 3.0 * auVar157._0_4_ * auVar157._0_4_;
                  fVar207 = auVar157._0_4_ * local_120 * local_120 * 3.0;
                  fVar209 = local_120 * local_120 * local_120;
                  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * auVar63._0_4_)),
                                            ZEXT416((uint)fVar207),auVar54);
                  auVar55 = vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar196),auVar53);
                  vfmadd231ss_fma(auVar55,ZEXT416((uint)fVar104),auVar47);
                  auVar47 = vucomiss_avx512f(ZEXT416(uVar37));
                  if (bVar40) {
                    fVar211 = *(float *)(ray + k * 4 + 0x100);
                    if (auVar47._0_4_ <= fVar211) {
                      auVar55 = vshufps_avx(auVar46,auVar46,0x55);
                      auVar54 = vsubps_avx512vl(auVar44,auVar55);
                      fVar195 = auVar55._0_4_;
                      auVar185._0_4_ = fVar195 * (float)local_340._0_4_;
                      fVar206 = auVar55._4_4_;
                      auVar185._4_4_ = fVar206 * (float)local_340._4_4_;
                      fVar212 = auVar55._8_4_;
                      auVar185._8_4_ = fVar212 * fStack_338;
                      fVar220 = auVar55._12_4_;
                      auVar185._12_4_ = fVar220 * fStack_334;
                      auVar191._0_4_ = fVar195 * (float)local_390._0_4_;
                      auVar191._4_4_ = fVar206 * (float)local_390._4_4_;
                      auVar191._8_4_ = fVar212 * fStack_388;
                      auVar191._12_4_ = fVar220 * fStack_384;
                      auVar204._0_4_ = fVar195 * (float)local_3a0._0_4_;
                      auVar204._4_4_ = fVar206 * (float)local_3a0._4_4_;
                      auVar204._8_4_ = fVar212 * fStack_398;
                      auVar204._12_4_ = fVar220 * fStack_394;
                      auVar162._0_4_ = fVar195 * (float)local_360._0_4_;
                      auVar162._4_4_ = fVar206 * (float)local_360._4_4_;
                      auVar162._8_4_ = fVar212 * fStack_358;
                      auVar162._12_4_ = fVar220 * fStack_354;
                      auVar44 = vfmadd231ps_fma(auVar185,auVar54,local_330);
                      auVar55 = vfmadd231ps_fma(auVar191,auVar54,local_370);
                      auVar53 = vfmadd231ps_fma(auVar204,auVar54,local_380);
                      auVar54 = vfmadd231ps_fma(auVar162,auVar54,local_350);
                      auVar44 = vsubps_avx(auVar55,auVar44);
                      auVar55 = vsubps_avx(auVar53,auVar55);
                      auVar53 = vsubps_avx(auVar54,auVar53);
                      auVar205._0_4_ = local_120 * auVar55._0_4_;
                      auVar205._4_4_ = local_120 * auVar55._4_4_;
                      auVar205._8_4_ = local_120 * auVar55._8_4_;
                      auVar205._12_4_ = local_120 * auVar55._12_4_;
                      auVar157._4_4_ = auVar157._0_4_;
                      auVar157._8_4_ = auVar157._0_4_;
                      auVar157._12_4_ = auVar157._0_4_;
                      auVar44 = vfmadd231ps_fma(auVar205,auVar157,auVar44);
                      auVar163._0_4_ = local_120 * auVar53._0_4_;
                      auVar163._4_4_ = local_120 * auVar53._4_4_;
                      auVar163._8_4_ = local_120 * auVar53._8_4_;
                      auVar163._12_4_ = local_120 * auVar53._12_4_;
                      auVar55 = vfmadd231ps_fma(auVar163,auVar157,auVar55);
                      auVar164._0_4_ = local_120 * auVar55._0_4_;
                      auVar164._4_4_ = local_120 * auVar55._4_4_;
                      auVar164._8_4_ = local_120 * auVar55._8_4_;
                      auVar164._12_4_ = local_120 * auVar55._12_4_;
                      auVar44 = vfmadd231ps_fma(auVar164,auVar157,auVar44);
                      auVar44 = vmulps_avx512vl(auVar44,auVar133);
                      pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                      if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01d04c23:
                        bVar33 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar33 = 1, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar149._0_4_ = fVar209 * (float)local_3e0._0_4_;
                        auVar149._4_4_ = fVar209 * (float)local_3e0._4_4_;
                        auVar149._8_4_ = fVar209 * fStack_3d8;
                        auVar149._12_4_ = fVar209 * fStack_3d4;
                        auVar136._4_4_ = fVar207;
                        auVar136._0_4_ = fVar207;
                        auVar136._8_4_ = fVar207;
                        auVar136._12_4_ = fVar207;
                        auVar55 = vfmadd132ps_fma(auVar136,auVar149,local_3d0);
                        auVar130._4_4_ = fVar196;
                        auVar130._0_4_ = fVar196;
                        auVar130._8_4_ = fVar196;
                        auVar130._12_4_ = fVar196;
                        auVar55 = vfmadd132ps_fma(auVar130,auVar55,local_3c0);
                        auVar121._4_4_ = fVar104;
                        auVar121._0_4_ = fVar104;
                        auVar121._8_4_ = fVar104;
                        auVar121._12_4_ = fVar104;
                        auVar54 = vfmadd132ps_fma(auVar121,auVar55,local_3b0);
                        auVar55 = vshufps_avx(auVar54,auVar54,0xc9);
                        auVar53 = vshufps_avx(auVar44,auVar44,0xc9);
                        auVar122._0_4_ = auVar54._0_4_ * auVar53._0_4_;
                        auVar122._4_4_ = auVar54._4_4_ * auVar53._4_4_;
                        auVar122._8_4_ = auVar54._8_4_ * auVar53._8_4_;
                        auVar122._12_4_ = auVar54._12_4_ * auVar53._12_4_;
                        auVar44 = vfmsub231ps_fma(auVar122,auVar44,auVar55);
                        auVar139._8_4_ = 1;
                        auVar139._0_8_ = 0x100000001;
                        auVar139._12_4_ = 1;
                        auVar139._16_4_ = 1;
                        auVar139._20_4_ = 1;
                        auVar139._24_4_ = 1;
                        auVar139._28_4_ = 1;
                        local_100 = vpermps_avx2(auVar139,ZEXT1632(auVar46));
                        auVar72 = vpermps_avx2(auVar139,ZEXT1632(auVar44));
                        local_160 = vpermps_avx512vl(auVar246._0_32_,ZEXT1632(auVar44));
                        local_140 = auVar44._0_4_;
                        local_180[0] = (RTCHitN)auVar72[0];
                        local_180[1] = (RTCHitN)auVar72[1];
                        local_180[2] = (RTCHitN)auVar72[2];
                        local_180[3] = (RTCHitN)auVar72[3];
                        local_180[4] = (RTCHitN)auVar72[4];
                        local_180[5] = (RTCHitN)auVar72[5];
                        local_180[6] = (RTCHitN)auVar72[6];
                        local_180[7] = (RTCHitN)auVar72[7];
                        local_180[8] = (RTCHitN)auVar72[8];
                        local_180[9] = (RTCHitN)auVar72[9];
                        local_180[10] = (RTCHitN)auVar72[10];
                        local_180[0xb] = (RTCHitN)auVar72[0xb];
                        local_180[0xc] = (RTCHitN)auVar72[0xc];
                        local_180[0xd] = (RTCHitN)auVar72[0xd];
                        local_180[0xe] = (RTCHitN)auVar72[0xe];
                        local_180[0xf] = (RTCHitN)auVar72[0xf];
                        local_180[0x10] = (RTCHitN)auVar72[0x10];
                        local_180[0x11] = (RTCHitN)auVar72[0x11];
                        local_180[0x12] = (RTCHitN)auVar72[0x12];
                        local_180[0x13] = (RTCHitN)auVar72[0x13];
                        local_180[0x14] = (RTCHitN)auVar72[0x14];
                        local_180[0x15] = (RTCHitN)auVar72[0x15];
                        local_180[0x16] = (RTCHitN)auVar72[0x16];
                        local_180[0x17] = (RTCHitN)auVar72[0x17];
                        local_180[0x18] = (RTCHitN)auVar72[0x18];
                        local_180[0x19] = (RTCHitN)auVar72[0x19];
                        local_180[0x1a] = (RTCHitN)auVar72[0x1a];
                        local_180[0x1b] = (RTCHitN)auVar72[0x1b];
                        local_180[0x1c] = (RTCHitN)auVar72[0x1c];
                        local_180[0x1d] = (RTCHitN)auVar72[0x1d];
                        local_180[0x1e] = (RTCHitN)auVar72[0x1e];
                        local_180[0x1f] = (RTCHitN)auVar72[0x1f];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = local_1e0._0_8_;
                        uStack_d8 = local_1e0._8_8_;
                        uStack_d0 = local_1e0._16_8_;
                        uStack_c8 = local_1e0._24_8_;
                        local_c0 = local_200;
                        vpcmpeqd_avx2(local_200,local_200);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = auVar47._0_4_;
                        local_400 = local_220;
                        local_430.valid = (int *)local_400;
                        local_430.geometryUserPtr = pGVar7->userPtr;
                        local_430.context = context->user;
                        local_430.ray = (RTCRayN *)ray;
                        local_430.hit = local_180;
                        local_430.N = 8;
                        if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar7->occlusionFilterN)(&local_430);
                          auVar248 = ZEXT464(0x3f800000);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar244 = ZEXT1664(auVar46);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar242 = ZEXT1664(auVar46);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar239 = ZEXT1664(auVar46);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
                          auVar246 = ZEXT3264(auVar72);
                        }
                        if (local_400 == (undefined1  [32])0x0) {
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar241 = ZEXT1664(auVar46);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar240 = ZEXT3264(auVar72);
                          auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar243 = ZEXT1664(auVar46);
                          auVar245 = ZEXT3264(_DAT_01feed20);
                          auVar46 = vxorps_avx512vl(auVar50,auVar50);
                          auVar247 = ZEXT1664(auVar46);
                        }
                        else {
                          p_Var10 = context->args->filter;
                          if (p_Var10 == (RTCFilterFunctionN)0x0) {
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar241 = ZEXT1664(auVar46);
                            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar240 = ZEXT3264(auVar72);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar46);
                            auVar245 = ZEXT3264(_DAT_01feed20);
                            auVar46 = vxorps_avx512vl(auVar50,auVar50);
                            auVar247 = ZEXT1664(auVar46);
                          }
                          else {
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar241 = ZEXT1664(auVar46);
                            auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar240 = ZEXT3264(auVar72);
                            auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar243 = ZEXT1664(auVar46);
                            auVar245 = ZEXT3264(_DAT_01feed20);
                            auVar46 = vxorps_avx512vl(auVar50,auVar50);
                            auVar247 = ZEXT1664(auVar46);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var10)(&local_430);
                              auVar46 = vxorps_avx512vl(auVar46,auVar46);
                              auVar247 = ZEXT1664(auVar46);
                              auVar248 = ZEXT464(0x3f800000);
                              auVar245 = ZEXT3264(_DAT_01feed20);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar244 = ZEXT1664(auVar46);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar243 = ZEXT1664(auVar46);
                              auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar240 = ZEXT3264(auVar72);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar242 = ZEXT1664(auVar46);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar241 = ZEXT1664(auVar46);
                              auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar239 = ZEXT1664(auVar46);
                              auVar72 = vbroadcastss_avx512vl(ZEXT416(2));
                              auVar246 = ZEXT3264(auVar72);
                            }
                          }
                          uVar30 = vptestmd_avx512vl(local_400,local_400);
                          auVar72 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar40 = (bool)((byte)uVar30 & 1);
                          bVar41 = (bool)((byte)(uVar30 >> 1) & 1);
                          bVar38 = (bool)((byte)(uVar30 >> 2) & 1);
                          bVar39 = (bool)((byte)(uVar30 >> 3) & 1);
                          bVar11 = (bool)((byte)(uVar30 >> 4) & 1);
                          bVar12 = (bool)((byte)(uVar30 >> 5) & 1);
                          bVar13 = (bool)((byte)(uVar30 >> 6) & 1);
                          bVar14 = SUB81(uVar30 >> 7,0);
                          *(uint *)(local_430.ray + 0x100) =
                               (uint)bVar40 * auVar72._0_4_ |
                               (uint)!bVar40 * *(int *)(local_430.ray + 0x100);
                          *(uint *)(local_430.ray + 0x104) =
                               (uint)bVar41 * auVar72._4_4_ |
                               (uint)!bVar41 * *(int *)(local_430.ray + 0x104);
                          *(uint *)(local_430.ray + 0x108) =
                               (uint)bVar38 * auVar72._8_4_ |
                               (uint)!bVar38 * *(int *)(local_430.ray + 0x108);
                          *(uint *)(local_430.ray + 0x10c) =
                               (uint)bVar39 * auVar72._12_4_ |
                               (uint)!bVar39 * *(int *)(local_430.ray + 0x10c);
                          *(uint *)(local_430.ray + 0x110) =
                               (uint)bVar11 * auVar72._16_4_ |
                               (uint)!bVar11 * *(int *)(local_430.ray + 0x110);
                          *(uint *)(local_430.ray + 0x114) =
                               (uint)bVar12 * auVar72._20_4_ |
                               (uint)!bVar12 * *(int *)(local_430.ray + 0x114);
                          *(uint *)(local_430.ray + 0x118) =
                               (uint)bVar13 * auVar72._24_4_ |
                               (uint)!bVar13 * *(int *)(local_430.ray + 0x118);
                          *(uint *)(local_430.ray + 0x11c) =
                               (uint)bVar14 * auVar72._28_4_ |
                               (uint)!bVar14 * *(int *)(local_430.ray + 0x11c);
                          bVar33 = 1;
                          if (local_400 != (undefined1  [32])0x0) goto LAB_01d04c25;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar211;
                        goto LAB_01d04c23;
                      }
LAB_01d04c25:
                      bVar27 = (bool)(bVar27 | bVar33);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar32 = lVar32 + -1;
      } while (lVar32 != 0);
      goto LAB_01d03cd6;
    }
    auVar50 = vinsertps_avx(auVar117,auVar56,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }